

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined8 uVar28;
  ulong uVar29;
  undefined8 uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  byte bVar90;
  ulong uVar91;
  uint uVar92;
  uint uVar93;
  long lVar94;
  long lVar95;
  Geometry *pGVar96;
  long lVar97;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined8 unaff_R13;
  ulong uVar98;
  long lVar99;
  size_t sVar100;
  byte bVar101;
  ulong uVar102;
  float fVar103;
  float fVar104;
  float fVar150;
  float fVar152;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar108 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar110 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar156;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar157 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  undefined4 uVar178;
  undefined1 auVar179 [32];
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar189;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar201;
  float fVar202;
  float fVar204;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar203;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 in_ZMM25 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [16];
  size_t local_808;
  undefined1 (*local_800) [32];
  Precalculations *local_7f8;
  ulong local_7f0;
  long local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar91 = (ulong)(byte)prim[1];
  fVar180 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar105 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar157 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar181 = vsubps_avx(auVar105,*(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  fVar188 = fVar180 * auVar181._0_4_;
  fVar156 = fVar180 * auVar157._0_4_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar91 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar105);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar91 * 5 + 6);
  auVar115 = vpmovsxbd_avx2(auVar109);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar91 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar107);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar125 = vpmovsxbd_avx2(auVar106);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar91 * 0xc + 6);
  auVar119 = vpmovsxbd_avx2(auVar5);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar118 = vpmovsxbd_avx2(auVar6);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar124 = vpmovsxbd_avx2(auVar7);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar91 * 0x13 + 6);
  auVar123 = vpmovsxbd_avx2(auVar8);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar91 * 0x14 + 6);
  auVar121 = vpmovsxbd_avx2(auVar9);
  auVar120 = vcvtdq2ps_avx(auVar121);
  auVar229._4_4_ = fVar156;
  auVar229._0_4_ = fVar156;
  auVar229._8_4_ = fVar156;
  auVar229._12_4_ = fVar156;
  auVar229._16_4_ = fVar156;
  auVar229._20_4_ = fVar156;
  auVar229._24_4_ = fVar156;
  auVar229._28_4_ = fVar156;
  auVar231._8_4_ = 1;
  auVar231._0_8_ = 0x100000001;
  auVar231._12_4_ = 1;
  auVar231._16_4_ = 1;
  auVar231._20_4_ = 1;
  auVar231._24_4_ = 1;
  auVar231._28_4_ = 1;
  auVar114 = ZEXT1632(CONCAT412(fVar180 * auVar157._12_4_,
                                CONCAT48(fVar180 * auVar157._8_4_,
                                         CONCAT44(fVar180 * auVar157._4_4_,fVar156))));
  auVar113 = vpermps_avx2(auVar231,auVar114);
  auVar111 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar235 = ZEXT3264(auVar111);
  auVar112 = vpermps_avx512vl(auVar111,auVar114);
  fVar156 = auVar112._0_4_;
  auVar171._0_4_ = fVar156 * auVar116._0_4_;
  fVar172 = auVar112._4_4_;
  auVar171._4_4_ = fVar172 * auVar116._4_4_;
  fVar173 = auVar112._8_4_;
  auVar171._8_4_ = fVar173 * auVar116._8_4_;
  fVar174 = auVar112._12_4_;
  auVar171._12_4_ = fVar174 * auVar116._12_4_;
  fVar175 = auVar112._16_4_;
  auVar171._16_4_ = fVar175 * auVar116._16_4_;
  fVar176 = auVar112._20_4_;
  auVar171._20_4_ = fVar176 * auVar116._20_4_;
  fVar177 = auVar112._24_4_;
  auVar171._28_36_ = in_ZMM4._28_36_;
  auVar171._24_4_ = fVar177 * auVar116._24_4_;
  auVar114._4_4_ = auVar118._4_4_ * fVar172;
  auVar114._0_4_ = auVar118._0_4_ * fVar156;
  auVar114._8_4_ = auVar118._8_4_ * fVar173;
  auVar114._12_4_ = auVar118._12_4_ * fVar174;
  auVar114._16_4_ = auVar118._16_4_ * fVar175;
  auVar114._20_4_ = auVar118._20_4_ * fVar176;
  auVar114._24_4_ = auVar118._24_4_ * fVar177;
  auVar114._28_4_ = auVar121._28_4_;
  auVar121._4_4_ = auVar120._4_4_ * fVar172;
  auVar121._0_4_ = auVar120._0_4_ * fVar156;
  auVar121._8_4_ = auVar120._8_4_ * fVar173;
  auVar121._12_4_ = auVar120._12_4_ * fVar174;
  auVar121._16_4_ = auVar120._16_4_ * fVar175;
  auVar121._20_4_ = auVar120._20_4_ * fVar176;
  auVar121._24_4_ = auVar120._24_4_ * fVar177;
  auVar121._28_4_ = auVar112._28_4_;
  auVar105 = vfmadd231ps_fma(auVar171._0_32_,auVar113,auVar115);
  auVar109 = vfmadd231ps_fma(auVar114,auVar113,auVar119);
  auVar107 = vfmadd231ps_fma(auVar121,auVar123,auVar113);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar229,auVar117);
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar229,auVar125);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar124,auVar229);
  auVar230._4_4_ = fVar188;
  auVar230._0_4_ = fVar188;
  auVar230._8_4_ = fVar188;
  auVar230._12_4_ = fVar188;
  auVar230._16_4_ = fVar188;
  auVar230._20_4_ = fVar188;
  auVar230._24_4_ = fVar188;
  auVar230._28_4_ = fVar188;
  auVar113 = ZEXT1632(CONCAT412(fVar180 * auVar181._12_4_,
                                CONCAT48(fVar180 * auVar181._8_4_,
                                         CONCAT44(fVar180 * auVar181._4_4_,fVar188))));
  auVar121 = vpermps_avx2(auVar231,auVar113);
  auVar113 = vpermps_avx512vl(auVar111,auVar113);
  auVar114 = vmulps_avx512vl(auVar113,auVar116);
  auVar196._0_4_ = auVar113._0_4_ * auVar118._0_4_;
  auVar196._4_4_ = auVar113._4_4_ * auVar118._4_4_;
  auVar196._8_4_ = auVar113._8_4_ * auVar118._8_4_;
  auVar196._12_4_ = auVar113._12_4_ * auVar118._12_4_;
  auVar196._16_4_ = auVar113._16_4_ * auVar118._16_4_;
  auVar196._20_4_ = auVar113._20_4_ * auVar118._20_4_;
  auVar196._24_4_ = auVar113._24_4_ * auVar118._24_4_;
  auVar196._28_4_ = 0;
  auVar118._4_4_ = auVar113._4_4_ * auVar120._4_4_;
  auVar118._0_4_ = auVar113._0_4_ * auVar120._0_4_;
  auVar118._8_4_ = auVar113._8_4_ * auVar120._8_4_;
  auVar118._12_4_ = auVar113._12_4_ * auVar120._12_4_;
  auVar118._16_4_ = auVar113._16_4_ * auVar120._16_4_;
  auVar118._20_4_ = auVar113._20_4_ * auVar120._20_4_;
  auVar118._24_4_ = auVar113._24_4_ * auVar120._24_4_;
  auVar118._28_4_ = auVar116._28_4_;
  auVar115 = vfmadd231ps_avx512vl(auVar114,auVar121,auVar115);
  auVar106 = vfmadd231ps_fma(auVar196,auVar121,auVar119);
  auVar5 = vfmadd231ps_fma(auVar118,auVar121,auVar123);
  auVar115 = vfmadd231ps_avx512vl(auVar115,auVar230,auVar117);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar230,auVar125);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar230,auVar124);
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar219._16_4_ = 0x7fffffff;
  auVar219._20_4_ = 0x7fffffff;
  auVar219._24_4_ = 0x7fffffff;
  auVar219._28_4_ = 0x7fffffff;
  auVar117 = vandps_avx(ZEXT1632(auVar105),auVar219);
  auVar217._8_4_ = 0x219392ef;
  auVar217._0_8_ = 0x219392ef219392ef;
  auVar217._12_4_ = 0x219392ef;
  auVar217._16_4_ = 0x219392ef;
  auVar217._20_4_ = 0x219392ef;
  auVar217._24_4_ = 0x219392ef;
  auVar217._28_4_ = 0x219392ef;
  uVar98 = vcmpps_avx512vl(auVar117,auVar217,1);
  bVar14 = (bool)((byte)uVar98 & 1);
  auVar113._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._0_4_;
  bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._4_4_;
  bVar14 = (bool)((byte)(uVar98 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._8_4_;
  bVar14 = (bool)((byte)(uVar98 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar98 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar98 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar98 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar98 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar109),auVar219);
  uVar98 = vcmpps_avx512vl(auVar117,auVar217,1);
  bVar14 = (bool)((byte)uVar98 & 1);
  auVar111._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar109._0_4_;
  bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar109._4_4_;
  bVar14 = (bool)((byte)(uVar98 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar109._8_4_;
  bVar14 = (bool)((byte)(uVar98 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar109._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar98 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar98 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar98 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar98 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar107),auVar219);
  uVar98 = vcmpps_avx512vl(auVar117,auVar217,1);
  bVar14 = (bool)((byte)uVar98 & 1);
  auVar117._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar107._0_4_;
  bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar107._4_4_;
  bVar14 = (bool)((byte)(uVar98 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar107._8_4_;
  bVar14 = (bool)((byte)(uVar98 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar107._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar98 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar98 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar98 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar98 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar113);
  auVar218._8_4_ = 0x3f800000;
  auVar218._0_8_ = 0x3f8000003f800000;
  auVar218._12_4_ = 0x3f800000;
  auVar218._16_4_ = 0x3f800000;
  auVar218._20_4_ = 0x3f800000;
  auVar218._24_4_ = 0x3f800000;
  auVar218._28_4_ = 0x3f800000;
  auVar105 = vfnmadd213ps_fma(auVar113,auVar116,auVar218);
  auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar111);
  auVar109 = vfnmadd213ps_fma(auVar111,auVar116,auVar218);
  auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar117);
  auVar107 = vfnmadd213ps_fma(auVar117,auVar116,auVar218);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar116,auVar116);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx512vl(auVar117,auVar115);
  auVar124._4_4_ = auVar105._4_4_ * auVar117._4_4_;
  auVar124._0_4_ = auVar105._0_4_ * auVar117._0_4_;
  auVar124._8_4_ = auVar105._8_4_ * auVar117._8_4_;
  auVar124._12_4_ = auVar105._12_4_ * auVar117._12_4_;
  auVar124._16_4_ = auVar117._16_4_ * 0.0;
  auVar124._20_4_ = auVar117._20_4_ * 0.0;
  auVar124._24_4_ = auVar117._24_4_ * 0.0;
  auVar124._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx512vl(auVar117,auVar115);
  auVar205._0_4_ = auVar105._0_4_ * auVar117._0_4_;
  auVar205._4_4_ = auVar105._4_4_ * auVar117._4_4_;
  auVar205._8_4_ = auVar105._8_4_ * auVar117._8_4_;
  auVar205._12_4_ = auVar105._12_4_ * auVar117._12_4_;
  auVar205._16_4_ = auVar117._16_4_ * 0.0;
  auVar205._20_4_ = auVar117._20_4_ * 0.0;
  auVar205._24_4_ = auVar117._24_4_ * 0.0;
  auVar205._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0xe + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar106));
  auVar118 = vpbroadcastd_avx512vl();
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar123._4_4_ = auVar109._4_4_ * auVar117._4_4_;
  auVar123._0_4_ = auVar109._0_4_ * auVar117._0_4_;
  auVar123._8_4_ = auVar109._8_4_ * auVar117._8_4_;
  auVar123._12_4_ = auVar109._12_4_ * auVar117._12_4_;
  auVar123._16_4_ = auVar117._16_4_ * 0.0;
  auVar123._20_4_ = auVar117._20_4_ * 0.0;
  auVar123._24_4_ = auVar117._24_4_ * 0.0;
  auVar123._28_4_ = auVar117._28_4_;
  auVar117 = vcvtdq2ps_avx(auVar115);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar106));
  auVar122._0_4_ = auVar109._0_4_ * auVar117._0_4_;
  auVar122._4_4_ = auVar109._4_4_ * auVar117._4_4_;
  auVar122._8_4_ = auVar109._8_4_ * auVar117._8_4_;
  auVar122._12_4_ = auVar109._12_4_ * auVar117._12_4_;
  auVar122._16_4_ = auVar117._16_4_ * 0.0;
  auVar122._20_4_ = auVar117._20_4_ * 0.0;
  auVar122._24_4_ = auVar117._24_4_ * 0.0;
  auVar122._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x15 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar5));
  auVar120._4_4_ = auVar117._4_4_ * auVar107._4_4_;
  auVar120._0_4_ = auVar117._0_4_ * auVar107._0_4_;
  auVar120._8_4_ = auVar117._8_4_ * auVar107._8_4_;
  auVar120._12_4_ = auVar117._12_4_ * auVar107._12_4_;
  auVar120._16_4_ = auVar117._16_4_ * 0.0;
  auVar120._20_4_ = auVar117._20_4_ * 0.0;
  auVar120._24_4_ = auVar117._24_4_ * 0.0;
  auVar120._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar5));
  auVar112._0_4_ = auVar107._0_4_ * auVar117._0_4_;
  auVar112._4_4_ = auVar107._4_4_ * auVar117._4_4_;
  auVar112._8_4_ = auVar107._8_4_ * auVar117._8_4_;
  auVar112._12_4_ = auVar107._12_4_ * auVar117._12_4_;
  auVar112._16_4_ = auVar117._16_4_ * 0.0;
  auVar112._20_4_ = auVar117._20_4_ * 0.0;
  auVar112._24_4_ = auVar117._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar117 = vpminsd_avx2(auVar124,auVar205);
  auVar115 = vpminsd_avx2(auVar123,auVar122);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115 = vpminsd_avx2(auVar120,auVar112);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar116._4_4_ = uVar178;
  auVar116._0_4_ = uVar178;
  auVar116._8_4_ = uVar178;
  auVar116._12_4_ = uVar178;
  auVar116._16_4_ = uVar178;
  auVar116._20_4_ = uVar178;
  auVar116._24_4_ = uVar178;
  auVar116._28_4_ = uVar178;
  auVar115 = vmaxps_avx512vl(auVar115,auVar116);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115._8_4_ = 0x3f7ffffa;
  auVar115._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar115._12_4_ = 0x3f7ffffa;
  auVar115._16_4_ = 0x3f7ffffa;
  auVar115._20_4_ = 0x3f7ffffa;
  auVar115._24_4_ = 0x3f7ffffa;
  auVar115._28_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar117,auVar115);
  auVar117 = vpmaxsd_avx2(auVar124,auVar205);
  auVar115 = vpmaxsd_avx2(auVar123,auVar122);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar115 = vpmaxsd_avx2(auVar120,auVar112);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar125._4_4_ = uVar178;
  auVar125._0_4_ = uVar178;
  auVar125._8_4_ = uVar178;
  auVar125._12_4_ = uVar178;
  auVar125._16_4_ = uVar178;
  auVar125._20_4_ = uVar178;
  auVar125._24_4_ = uVar178;
  auVar125._28_4_ = uVar178;
  auVar115 = vminps_avx512vl(auVar115,auVar125);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar119._8_4_ = 0x3f800003;
  auVar119._0_8_ = 0x3f8000033f800003;
  auVar119._12_4_ = 0x3f800003;
  auVar119._16_4_ = 0x3f800003;
  auVar119._20_4_ = 0x3f800003;
  auVar119._24_4_ = 0x3f800003;
  auVar119._28_4_ = 0x3f800003;
  auVar117 = vmulps_avx512vl(auVar117,auVar119);
  uVar28 = vcmpps_avx512vl(local_3a0,auVar117,2);
  uVar30 = vpcmpgtd_avx512vl(auVar118,_DAT_01fb4ba0);
  uVar98 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar28 & (byte)uVar30));
  local_800 = (undefined1 (*) [32])local_100;
  auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar236 = ZEXT1664(auVar105);
  auVar171 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar171);
  sVar100 = k;
  local_808 = k;
  local_7f8 = pre;
  do {
    if (uVar98 == 0) {
      return;
    }
    lVar97 = 0;
    for (uVar91 = uVar98; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
      lVar97 = lVar97 + 1;
    }
    uVar10 = *(uint *)(prim + 2);
    uVar92 = *(uint *)(prim + lVar97 * 4 + 6);
    local_7f0 = (ulong)uVar92;
    pGVar96 = (context->scene->geometries).items[uVar10].ptr;
    lVar97 = *(long *)&pGVar96[1].time_range.upper;
    uVar91 = (ulong)*(uint *)(*(long *)&pGVar96->field_0x58 +
                             local_7f0 *
                             pGVar96[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar94 = (long)pGVar96[1].intersectionFilterN * uVar91;
    auVar105 = *(undefined1 (*) [16])(lVar97 + lVar94);
    lVar95 = (long)pGVar96[1].intersectionFilterN * (uVar91 + 1);
    auVar109 = *(undefined1 (*) [16])(lVar97 + lVar95);
    auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar100 * 4)),
                             ZEXT416(*(uint *)(ray + sVar100 * 4 + 0x40)),0x1c);
    auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + sVar100 * 4 + 0x80)),0x28);
    iVar11 = (int)pGVar96[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar157._8_4_ = 0xbeaaaaab;
    auVar157._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar157._12_4_ = 0xbeaaaaab;
    auVar32 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                (pGVar96[2].intersectionFilterN +
                                uVar91 * (long)pGVar96[2].pointQueryFunc),auVar105,auVar157);
    auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar96[2].intersectionFilterN +
                              (long)pGVar96[2].pointQueryFunc * (uVar91 + 1)),auVar109,auVar157);
    auVar5 = vsubps_avx(auVar105,auVar107);
    uVar178 = auVar5._0_4_;
    auVar190._4_4_ = uVar178;
    auVar190._0_4_ = uVar178;
    auVar190._8_4_ = uVar178;
    auVar190._12_4_ = uVar178;
    auVar106 = vshufps_avx(auVar5,auVar5,0x55);
    aVar3 = pre->ray_space[k].vx.field_0;
    aVar4 = pre->ray_space[k].vy.field_0;
    auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
    fVar180 = pre->ray_space[k].vz.field_0.m128[0];
    fVar156 = pre->ray_space[k].vz.field_0.m128[1];
    fVar172 = pre->ray_space[k].vz.field_0.m128[2];
    fVar173 = pre->ray_space[k].vz.field_0.m128[3];
    auVar222._0_4_ = fVar180 * auVar5._0_4_;
    auVar222._4_4_ = fVar156 * auVar5._4_4_;
    auVar222._8_4_ = fVar172 * auVar5._8_4_;
    auVar222._12_4_ = fVar173 * auVar5._12_4_;
    auVar106 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar4,auVar106);
    auVar7 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar3,auVar190);
    auVar5 = vsubps_avx(auVar32,auVar107);
    uVar178 = auVar5._0_4_;
    auVar191._4_4_ = uVar178;
    auVar191._0_4_ = uVar178;
    auVar191._8_4_ = uVar178;
    auVar191._12_4_ = uVar178;
    auVar106 = vshufps_avx(auVar5,auVar5,0x55);
    auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
    auVar110._0_4_ = fVar180 * auVar5._0_4_;
    auVar110._4_4_ = fVar156 * auVar5._4_4_;
    auVar110._8_4_ = fVar172 * auVar5._8_4_;
    auVar110._12_4_ = fVar173 * auVar5._12_4_;
    auVar106 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar106);
    auVar8 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar3,auVar191);
    auVar5 = vsubps_avx(auVar6,auVar107);
    uVar178 = auVar5._0_4_;
    auVar108._4_4_ = uVar178;
    auVar108._0_4_ = uVar178;
    auVar108._8_4_ = uVar178;
    auVar108._12_4_ = uVar178;
    auVar106 = vshufps_avx(auVar5,auVar5,0x55);
    auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
    auVar224._0_4_ = fVar180 * auVar5._0_4_;
    auVar224._4_4_ = fVar156 * auVar5._4_4_;
    auVar224._8_4_ = fVar172 * auVar5._8_4_;
    auVar224._12_4_ = fVar173 * auVar5._12_4_;
    auVar106 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar4,auVar106);
    auVar5 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar3,auVar108);
    auVar106 = vsubps_avx(auVar109,auVar107);
    uVar178 = auVar106._0_4_;
    auVar181._4_4_ = uVar178;
    auVar181._0_4_ = uVar178;
    auVar181._8_4_ = uVar178;
    auVar181._12_4_ = uVar178;
    auVar107 = vshufps_avx(auVar106,auVar106,0x55);
    auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
    auVar228._0_4_ = fVar180 * auVar106._0_4_;
    auVar228._4_4_ = fVar156 * auVar106._4_4_;
    auVar228._8_4_ = fVar172 * auVar106._8_4_;
    auVar228._12_4_ = fVar173 * auVar106._12_4_;
    auVar107 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar4,auVar107);
    local_7e8 = (long)iVar11;
    lVar99 = local_7e8 * 0x44;
    auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar99);
    auVar9 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar3,auVar181);
    uVar178 = auVar7._0_4_;
    local_600._4_4_ = uVar178;
    local_600._0_4_ = uVar178;
    local_600._8_4_ = uVar178;
    local_600._12_4_ = uVar178;
    local_600._16_4_ = uVar178;
    local_600._20_4_ = uVar178;
    local_600._24_4_ = uVar178;
    local_600._28_4_ = uVar178;
    auVar162._8_4_ = 1;
    auVar162._0_8_ = 0x100000001;
    auVar162._12_4_ = 1;
    auVar162._16_4_ = 1;
    auVar162._20_4_ = 1;
    auVar162._24_4_ = 1;
    auVar162._28_4_ = 1;
    local_620 = vpermps_avx2(auVar162,ZEXT1632(auVar7));
    auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 + 0x484);
    local_640 = vbroadcastss_avx512vl(auVar8);
    local_660 = vpermps_avx512vl(auVar162,ZEXT1632(auVar8));
    auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 + 0x908);
    local_680 = vbroadcastss_avx512vl(auVar5);
    auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 + 0xd8c);
    local_6a0 = vpermps_avx512vl(auVar162,ZEXT1632(auVar5));
    uVar178 = auVar9._0_4_;
    local_6c0._4_4_ = uVar178;
    local_6c0._0_4_ = uVar178;
    fStack_6b8 = (float)uVar178;
    fStack_6b4 = (float)uVar178;
    fStack_6b0 = (float)uVar178;
    fStack_6ac = (float)uVar178;
    fStack_6a8 = (float)uVar178;
    register0x0000139c = uVar178;
    _local_6e0 = vpermps_avx512vl(auVar162,ZEXT1632(auVar9));
    auVar119 = vmulps_avx512vl(_local_6c0,auVar125);
    auVar118 = vmulps_avx512vl(_local_6e0,auVar125);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_680);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_6a0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar115,local_640);
    auVar120 = vfmadd231ps_avx512vl(auVar118,auVar115,local_660);
    auVar157 = vfmadd231ps_fma(auVar119,auVar117,local_600);
    auVar215 = ZEXT1664(auVar157);
    auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar99);
    auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 + 0x484);
    auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 + 0x908);
    auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 + 0xd8c);
    auVar181 = vfmadd231ps_fma(auVar120,auVar117,local_620);
    auVar210 = ZEXT1664(auVar181);
    auVar120 = vmulps_avx512vl(_local_6c0,auVar123);
    auVar121 = vmulps_avx512vl(_local_6e0,auVar123);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar124,local_680);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_6a0);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar118,local_640);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,local_660);
    auVar190 = vfmadd231ps_fma(auVar120,auVar119,local_600);
    auVar220 = ZEXT1664(auVar190);
    auVar191 = vfmadd231ps_fma(auVar121,auVar119,local_620);
    auVar120 = vsubps_avx512vl(ZEXT1632(auVar190),ZEXT1632(auVar157));
    auVar121 = vsubps_avx512vl(ZEXT1632(auVar191),ZEXT1632(auVar181));
    auVar113 = vmulps_avx512vl(ZEXT1632(auVar181),auVar120);
    auVar114 = vmulps_avx512vl(ZEXT1632(auVar157),auVar121);
    auVar113 = vsubps_avx512vl(auVar113,auVar114);
    auVar107 = vshufps_avx(auVar32,auVar32,0xff);
    local_3c0 = vbroadcastsd_avx512vl(auVar107);
    auVar107 = vshufps_avx(auVar6,auVar6,0xff);
    local_3e0 = vbroadcastsd_avx512vl(auVar107);
    local_400 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar97 + 0xc + lVar95)));
    auVar114 = vmulps_avx512vl(local_400,auVar125);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_3e0);
    local_420 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar97 + 0xc + lVar94)));
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar115,local_3c0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_420);
    auVar111 = vmulps_avx512vl(local_400,auVar123);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar124,local_3e0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_3c0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,local_420);
    auVar112 = vmulps_avx512vl(auVar121,auVar121);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar120,auVar120);
    auVar122 = vmaxps_avx512vl(auVar114,auVar111);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar112 = vmulps_avx512vl(auVar122,auVar112);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    uVar28 = vcmpps_avx512vl(auVar113,auVar112,2);
    auVar107 = vinsertps_avx512f(auVar7,local_420._0_16_,0x30);
    auVar222 = auVar236._0_16_;
    auVar106 = vandps_avx512vl(auVar107,auVar222);
    auVar107 = vblendps_avx(auVar8,auVar32,8);
    auVar107 = vandps_avx512vl(auVar107,auVar222);
    auVar106 = vmaxps_avx512vl(auVar106,auVar107);
    auVar107 = vblendps_avx(auVar5,auVar6,8);
    auVar108 = vandps_avx512vl(auVar107,auVar222);
    auVar107 = vinsertps_avx512f(auVar9,local_400._0_16_,0x30);
    auVar107 = vandps_avx512vl(auVar107,auVar222);
    auVar107 = vmaxps_avx512vl(auVar108,auVar107);
    auVar107 = vmaxps_avx(auVar106,auVar107);
    auVar106 = vmovshdup_avx(auVar107);
    auVar106 = vmaxss_avx(auVar106,auVar107);
    auVar107 = vshufpd_avx(auVar107,auVar107,1);
    auVar107 = vmaxss_avx(auVar107,auVar106);
    auVar106 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar11);
    local_7c0._0_16_ = auVar106;
    auVar226._0_4_ = auVar106._0_4_;
    auVar226._4_4_ = auVar226._0_4_;
    auVar226._8_4_ = auVar226._0_4_;
    auVar226._12_4_ = auVar226._0_4_;
    auVar226._16_4_ = auVar226._0_4_;
    auVar226._20_4_ = auVar226._0_4_;
    auVar226._24_4_ = auVar226._0_4_;
    auVar226._28_4_ = auVar226._0_4_;
    uVar30 = vcmpps_avx512vl(auVar226,_DAT_01f7b060,0xe);
    bVar101 = (byte)uVar28 & (byte)uVar30;
    fVar180 = auVar107._0_4_ * 4.7683716e-07;
    local_820 = ZEXT416((uint)fVar180);
    auVar113 = auVar235._0_32_;
    local_7a0 = vpermps_avx512vl(auVar113,ZEXT1632(auVar7));
    auVar237 = ZEXT3264(local_7a0);
    local_480 = vpermps_avx512vl(auVar113,ZEXT1632(auVar8));
    local_4a0 = vpermps_avx512vl(auVar113,ZEXT1632(auVar5));
    local_4c0 = vpermps_avx512vl(auVar113,ZEXT1632(auVar9));
    local_760 = *(undefined4 *)(ray + sVar100 * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar171 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar171);
    auVar171 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar171);
    local_860 = auVar105._0_8_;
    uStack_858 = auVar105._8_8_;
    local_880 = auVar32._0_8_;
    uStack_878 = auVar32._8_8_;
    local_890 = auVar6._0_8_;
    uStack_888 = auVar6._8_8_;
    local_870._0_4_ = auVar109._0_4_;
    fVar156 = (float)local_870;
    local_870._4_4_ = auVar109._4_4_;
    fVar172 = local_870._4_4_;
    uStack_868._0_4_ = auVar109._8_4_;
    fVar173 = (float)uStack_868;
    uStack_868._4_4_ = auVar109._12_4_;
    fVar174 = uStack_868._4_4_;
    local_870 = auVar109._0_8_;
    uStack_868 = auVar109._8_8_;
    if (bVar101 != 0) {
      in_ZMM25 = ZEXT3264(local_4c0);
      auVar123 = vmulps_avx512vl(local_4c0,auVar123);
      auVar124 = vfmadd213ps_avx512vl(auVar124,local_4a0,auVar123);
      auVar118 = vfmadd213ps_avx512vl(auVar118,local_480,auVar124);
      auVar118 = vfmadd213ps_avx512vl(auVar119,local_7a0,auVar118);
      auVar125 = vmulps_avx512vl(local_4c0,auVar125);
      auVar116 = vfmadd213ps_avx512vl(auVar116,local_4a0,auVar125);
      auVar124 = vfmadd213ps_avx512vl(auVar115,local_480,auVar116);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 + 0x1210);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 + 0x1694);
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 + 0x1b18);
      auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 + 0x1f9c);
      auVar124 = vfmadd213ps_avx512vl(auVar117,local_7a0,auVar124);
      auVar117 = vmulps_avx512vl(_local_6c0,auVar119);
      auVar123 = vmulps_avx512vl(_local_6e0,auVar119);
      auVar119 = vmulps_avx512vl(local_4c0,auVar119);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar125,local_680);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,local_6a0);
      auVar125 = vfmadd231ps_avx512vl(auVar119,local_4a0,auVar125);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,local_640);
      auVar119 = vfmadd231ps_avx512vl(auVar123,auVar116,local_660);
      auVar123 = vfmadd231ps_avx512vl(auVar125,local_480,auVar116);
      auVar113 = vfmadd231ps_avx512vl(auVar117,auVar115,local_600);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar115,local_620);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 + 0x1210);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 + 0x1b18);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 + 0x1f9c);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_7a0,auVar115);
      auVar115 = vmulps_avx512vl(_local_6c0,auVar125);
      auVar112 = vmulps_avx512vl(_local_6e0,auVar125);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar236 = ZEXT1664(auVar109);
      auVar125 = vmulps_avx512vl(local_4c0,auVar125);
      auVar122 = vfmadd231ps_avx512vl(auVar115,auVar116,local_680);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_6a0);
      auVar116 = vfmadd231ps_avx512vl(auVar125,local_4a0,auVar116);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 + 0x1694);
      auVar125 = vfmadd231ps_avx512vl(auVar122,auVar115,local_640);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_660);
      auVar115 = vfmadd231ps_avx512vl(auVar116,local_480,auVar115);
      auVar116 = vfmadd231ps_avx512vl(auVar125,auVar117,local_600);
      auVar125 = vfmadd231ps_avx512vl(auVar112,auVar117,local_620);
      auVar112 = vfmadd231ps_avx512vl(auVar115,local_7a0,auVar117);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar232._16_4_ = 0x7fffffff;
      auVar232._20_4_ = 0x7fffffff;
      auVar232._24_4_ = 0x7fffffff;
      auVar232._28_4_ = 0x7fffffff;
      auVar117 = vandps_avx(auVar113,auVar232);
      auVar115 = vandps_avx(auVar119,auVar232);
      auVar115 = vmaxps_avx(auVar117,auVar115);
      auVar117 = vandps_avx(auVar123,auVar232);
      auVar117 = vmaxps_avx(auVar115,auVar117);
      auVar227._4_4_ = fVar180;
      auVar227._0_4_ = fVar180;
      auVar227._8_4_ = fVar180;
      auVar227._12_4_ = fVar180;
      auVar227._16_4_ = fVar180;
      auVar227._20_4_ = fVar180;
      auVar227._24_4_ = fVar180;
      auVar227._28_4_ = fVar180;
      uVar91 = vcmpps_avx512vl(auVar117,auVar227,1);
      bVar14 = (bool)((byte)uVar91 & 1);
      auVar126._0_4_ = (float)((uint)bVar14 * auVar120._0_4_ | (uint)!bVar14 * auVar113._0_4_);
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar126._4_4_ = (float)((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar113._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar126._8_4_ = (float)((uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar113._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar126._12_4_ = (float)((uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar113._12_4_);
      bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
      auVar126._16_4_ = (float)((uint)bVar14 * auVar120._16_4_ | (uint)!bVar14 * auVar113._16_4_);
      bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
      auVar126._20_4_ = (float)((uint)bVar14 * auVar120._20_4_ | (uint)!bVar14 * auVar113._20_4_);
      bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
      auVar126._24_4_ = (float)((uint)bVar14 * auVar120._24_4_ | (uint)!bVar14 * auVar113._24_4_);
      bVar14 = SUB81(uVar91 >> 7,0);
      auVar126._28_4_ = (uint)bVar14 * auVar120._28_4_ | (uint)!bVar14 * auVar113._28_4_;
      bVar14 = (bool)((byte)uVar91 & 1);
      auVar127._0_4_ = (float)((uint)bVar14 * auVar121._0_4_ | (uint)!bVar14 * auVar119._0_4_);
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar127._4_4_ = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar119._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar127._8_4_ = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar119._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar127._12_4_ = (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar119._12_4_);
      bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
      auVar127._16_4_ = (float)((uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * auVar119._16_4_);
      bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
      auVar127._20_4_ = (float)((uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * auVar119._20_4_);
      bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
      auVar127._24_4_ = (float)((uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * auVar119._24_4_);
      bVar14 = SUB81(uVar91 >> 7,0);
      auVar127._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar119._28_4_;
      vandps_avx512vl(auVar116,auVar232);
      auVar117 = vandps_avx(auVar125,auVar232);
      auVar115 = vmaxps_avx(auVar127,auVar117);
      auVar117 = vandps_avx(auVar112,auVar232);
      auVar117 = vmaxps_avx(auVar115,auVar117);
      uVar91 = vcmpps_avx512vl(auVar117,auVar227,1);
      bVar14 = (bool)((byte)uVar91 & 1);
      auVar128._0_4_ = (uint)bVar14 * auVar120._0_4_ | (uint)!bVar14 * auVar116._0_4_;
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar116._4_4_;
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar116._8_4_;
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar116._12_4_;
      bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar14 * auVar120._16_4_ | (uint)!bVar14 * auVar116._16_4_;
      bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar14 * auVar120._20_4_ | (uint)!bVar14 * auVar116._20_4_;
      bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar14 * auVar120._24_4_ | (uint)!bVar14 * auVar116._24_4_;
      bVar14 = SUB81(uVar91 >> 7,0);
      auVar128._28_4_ = (uint)bVar14 * auVar120._28_4_ | (uint)!bVar14 * auVar116._28_4_;
      bVar14 = (bool)((byte)uVar91 & 1);
      auVar129._0_4_ = (float)((uint)bVar14 * auVar121._0_4_ | (uint)!bVar14 * auVar125._0_4_);
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar129._4_4_ = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar125._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar129._8_4_ = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar125._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar129._12_4_ = (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar125._12_4_);
      bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
      auVar129._16_4_ = (float)((uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * auVar125._16_4_);
      bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
      auVar129._20_4_ = (float)((uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * auVar125._20_4_);
      bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
      auVar129._24_4_ = (float)((uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * auVar125._24_4_);
      bVar14 = SUB81(uVar91 >> 7,0);
      auVar129._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar125._28_4_;
      auVar225._8_4_ = 0x80000000;
      auVar225._0_8_ = 0x8000000080000000;
      auVar225._12_4_ = 0x80000000;
      auVar225._16_4_ = 0x80000000;
      auVar225._20_4_ = 0x80000000;
      auVar225._24_4_ = 0x80000000;
      auVar225._28_4_ = 0x80000000;
      auVar117 = vxorps_avx512vl(auVar128,auVar225);
      auVar110 = vxorps_avx512vl(local_620._0_16_,local_620._0_16_);
      auVar115 = vfmadd213ps_avx512vl(auVar126,auVar126,ZEXT1632(auVar110));
      auVar109 = vfmadd231ps_fma(auVar115,auVar127,auVar127);
      auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar109));
      auVar233._8_4_ = 0xbf000000;
      auVar233._0_8_ = 0xbf000000bf000000;
      auVar233._12_4_ = 0xbf000000;
      auVar233._16_4_ = 0xbf000000;
      auVar233._20_4_ = 0xbf000000;
      auVar233._24_4_ = 0xbf000000;
      auVar233._28_4_ = 0xbf000000;
      fVar175 = auVar115._0_4_;
      fVar176 = auVar115._4_4_;
      fVar177 = auVar115._8_4_;
      fVar188 = auVar115._12_4_;
      fVar189 = auVar115._16_4_;
      fVar201 = auVar115._20_4_;
      fVar202 = auVar115._24_4_;
      auVar42._4_4_ = fVar176 * fVar176 * fVar176 * auVar109._4_4_ * -0.5;
      auVar42._0_4_ = fVar175 * fVar175 * fVar175 * auVar109._0_4_ * -0.5;
      auVar42._8_4_ = fVar177 * fVar177 * fVar177 * auVar109._8_4_ * -0.5;
      auVar42._12_4_ = fVar188 * fVar188 * fVar188 * auVar109._12_4_ * -0.5;
      auVar42._16_4_ = fVar189 * fVar189 * fVar189 * -0.0;
      auVar42._20_4_ = fVar201 * fVar201 * fVar201 * -0.0;
      auVar42._24_4_ = fVar202 * fVar202 * fVar202 * -0.0;
      auVar42._28_4_ = 0;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar125 = vfmadd231ps_avx512vl(auVar42,auVar116,auVar115);
      auVar43._4_4_ = auVar127._4_4_ * auVar125._4_4_;
      auVar43._0_4_ = auVar127._0_4_ * auVar125._0_4_;
      auVar43._8_4_ = auVar127._8_4_ * auVar125._8_4_;
      auVar43._12_4_ = auVar127._12_4_ * auVar125._12_4_;
      auVar43._16_4_ = auVar127._16_4_ * auVar125._16_4_;
      auVar43._20_4_ = auVar127._20_4_ * auVar125._20_4_;
      auVar43._24_4_ = auVar127._24_4_ * auVar125._24_4_;
      auVar43._28_4_ = auVar115._28_4_;
      auVar44._4_4_ = auVar125._4_4_ * -auVar126._4_4_;
      auVar44._0_4_ = auVar125._0_4_ * -auVar126._0_4_;
      auVar44._8_4_ = auVar125._8_4_ * -auVar126._8_4_;
      auVar44._12_4_ = auVar125._12_4_ * -auVar126._12_4_;
      auVar44._16_4_ = auVar125._16_4_ * -auVar126._16_4_;
      auVar44._20_4_ = auVar125._20_4_ * -auVar126._20_4_;
      auVar44._24_4_ = auVar125._24_4_ * -auVar126._24_4_;
      auVar44._28_4_ = auVar126._28_4_ ^ 0x80000000;
      auVar125 = vmulps_avx512vl(auVar125,ZEXT1632(auVar110));
      auVar123 = ZEXT1632(auVar110);
      auVar115 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar123);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar129,auVar129);
      auVar119 = vrsqrt14ps_avx512vl(auVar115);
      auVar115 = vmulps_avx512vl(auVar115,auVar233);
      fVar175 = auVar119._0_4_;
      fVar176 = auVar119._4_4_;
      fVar177 = auVar119._8_4_;
      fVar188 = auVar119._12_4_;
      fVar189 = auVar119._16_4_;
      fVar201 = auVar119._20_4_;
      fVar202 = auVar119._24_4_;
      auVar45._4_4_ = fVar176 * fVar176 * fVar176 * auVar115._4_4_;
      auVar45._0_4_ = fVar175 * fVar175 * fVar175 * auVar115._0_4_;
      auVar45._8_4_ = fVar177 * fVar177 * fVar177 * auVar115._8_4_;
      auVar45._12_4_ = fVar188 * fVar188 * fVar188 * auVar115._12_4_;
      auVar45._16_4_ = fVar189 * fVar189 * fVar189 * auVar115._16_4_;
      auVar45._20_4_ = fVar201 * fVar201 * fVar201 * auVar115._20_4_;
      auVar45._24_4_ = fVar202 * fVar202 * fVar202 * auVar115._24_4_;
      auVar45._28_4_ = 0xbf000000;
      auVar116 = vfmadd231ps_avx512vl(auVar45,auVar116,auVar119);
      auVar46._4_4_ = auVar129._4_4_ * auVar116._4_4_;
      auVar46._0_4_ = auVar129._0_4_ * auVar116._0_4_;
      auVar46._8_4_ = auVar129._8_4_ * auVar116._8_4_;
      auVar46._12_4_ = auVar129._12_4_ * auVar116._12_4_;
      auVar46._16_4_ = auVar129._16_4_ * auVar116._16_4_;
      auVar46._20_4_ = auVar129._20_4_ * auVar116._20_4_;
      auVar46._24_4_ = auVar129._24_4_ * auVar116._24_4_;
      auVar46._28_4_ = auVar119._28_4_;
      auVar47._4_4_ = auVar116._4_4_ * auVar117._4_4_;
      auVar47._0_4_ = auVar116._0_4_ * auVar117._0_4_;
      auVar47._8_4_ = auVar116._8_4_ * auVar117._8_4_;
      auVar47._12_4_ = auVar116._12_4_ * auVar117._12_4_;
      auVar47._16_4_ = auVar116._16_4_ * auVar117._16_4_;
      auVar47._20_4_ = auVar116._20_4_ * auVar117._20_4_;
      auVar47._24_4_ = auVar116._24_4_ * auVar117._24_4_;
      auVar47._28_4_ = auVar115._28_4_;
      auVar117 = vmulps_avx512vl(auVar116,auVar123);
      auVar109 = vfmadd213ps_fma(auVar43,auVar114,ZEXT1632(auVar157));
      auVar107 = vfmadd213ps_fma(auVar44,auVar114,ZEXT1632(auVar181));
      auVar116 = vfmadd213ps_avx512vl(auVar125,auVar114,auVar124);
      auVar119 = vfmadd213ps_avx512vl(auVar46,auVar111,ZEXT1632(auVar190));
      auVar157 = vfnmadd213ps_fma(auVar43,auVar114,ZEXT1632(auVar157));
      auVar106 = vfmadd213ps_fma(auVar47,auVar111,ZEXT1632(auVar191));
      auVar181 = vfnmadd213ps_fma(auVar44,auVar114,ZEXT1632(auVar181));
      auVar5 = vfmadd213ps_fma(auVar117,auVar111,auVar118);
      auVar108 = vfnmadd231ps_fma(auVar124,auVar114,auVar125);
      auVar190 = vfnmadd213ps_fma(auVar46,auVar111,ZEXT1632(auVar190));
      auVar191 = vfnmadd213ps_fma(auVar47,auVar111,ZEXT1632(auVar191));
      auVar222 = vfnmadd231ps_fma(auVar118,auVar111,auVar117);
      auVar118 = vsubps_avx512vl(auVar119,ZEXT1632(auVar157));
      auVar117 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar181));
      auVar115 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar108));
      auVar48._4_4_ = auVar117._4_4_ * auVar108._4_4_;
      auVar48._0_4_ = auVar117._0_4_ * auVar108._0_4_;
      auVar48._8_4_ = auVar117._8_4_ * auVar108._8_4_;
      auVar48._12_4_ = auVar117._12_4_ * auVar108._12_4_;
      auVar48._16_4_ = auVar117._16_4_ * 0.0;
      auVar48._20_4_ = auVar117._20_4_ * 0.0;
      auVar48._24_4_ = auVar117._24_4_ * 0.0;
      auVar48._28_4_ = auVar125._28_4_;
      auVar7 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar181),auVar115);
      auVar49._4_4_ = auVar115._4_4_ * auVar157._4_4_;
      auVar49._0_4_ = auVar115._0_4_ * auVar157._0_4_;
      auVar49._8_4_ = auVar115._8_4_ * auVar157._8_4_;
      auVar49._12_4_ = auVar115._12_4_ * auVar157._12_4_;
      auVar49._16_4_ = auVar115._16_4_ * 0.0;
      auVar49._20_4_ = auVar115._20_4_ * 0.0;
      auVar49._24_4_ = auVar115._24_4_ * 0.0;
      auVar49._28_4_ = auVar115._28_4_;
      auVar8 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar108),auVar118);
      auVar50._4_4_ = auVar181._4_4_ * auVar118._4_4_;
      auVar50._0_4_ = auVar181._0_4_ * auVar118._0_4_;
      auVar50._8_4_ = auVar181._8_4_ * auVar118._8_4_;
      auVar50._12_4_ = auVar181._12_4_ * auVar118._12_4_;
      auVar50._16_4_ = auVar118._16_4_ * 0.0;
      auVar50._20_4_ = auVar118._20_4_ * 0.0;
      auVar50._24_4_ = auVar118._24_4_ * 0.0;
      auVar50._28_4_ = auVar118._28_4_;
      auVar9 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar157),auVar117);
      auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar123,ZEXT1632(auVar8));
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar123,ZEXT1632(auVar7));
      auVar112 = ZEXT1632(auVar110);
      uVar91 = vcmpps_avx512vl(auVar117,auVar112,2);
      bVar90 = (byte)uVar91;
      fVar103 = (float)((uint)(bVar90 & 1) * auVar109._0_4_ |
                       (uint)!(bool)(bVar90 & 1) * auVar190._0_4_);
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      fVar150 = (float)((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar190._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      fVar152 = (float)((uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar190._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      fVar154 = (float)((uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar190._12_4_);
      auVar124 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar152,CONCAT44(fVar150,fVar103))));
      fVar104 = (float)((uint)(bVar90 & 1) * auVar107._0_4_ |
                       (uint)!(bool)(bVar90 & 1) * auVar191._0_4_);
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      fVar151 = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar191._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      fVar153 = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar191._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      fVar155 = (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar191._12_4_);
      auVar123 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar153,CONCAT44(fVar151,fVar104))));
      auVar130._0_4_ =
           (float)((uint)(bVar90 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar222._0_4_)
      ;
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar130._4_4_ = (float)((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar222._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar130._8_4_ = (float)((uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar222._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar130._12_4_ = (float)((uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar222._12_4_);
      fVar176 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar116._16_4_);
      auVar130._16_4_ = fVar176;
      fVar175 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar116._20_4_);
      auVar130._20_4_ = fVar175;
      fVar177 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar116._24_4_);
      auVar130._24_4_ = fVar177;
      iVar1 = (uint)(byte)(uVar91 >> 7) * auVar116._28_4_;
      auVar130._28_4_ = iVar1;
      auVar117 = vblendmps_avx512vl(ZEXT1632(auVar157),auVar119);
      auVar131._0_4_ =
           (uint)(bVar90 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar109._0_4_;
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar109._4_4_;
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar109._8_4_;
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar109._12_4_;
      auVar131._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * auVar117._16_4_;
      auVar131._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * auVar117._20_4_;
      auVar131._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * auVar117._24_4_;
      auVar131._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar117._28_4_;
      auVar117 = vblendmps_avx512vl(ZEXT1632(auVar181),ZEXT1632(auVar106));
      auVar132._0_4_ =
           (float)((uint)(bVar90 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar7._0_4_);
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar132._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar7._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar132._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar7._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar132._12_4_ = (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar7._12_4_);
      fVar188 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar117._16_4_);
      auVar132._16_4_ = fVar188;
      fVar189 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar117._20_4_);
      auVar132._20_4_ = fVar189;
      fVar201 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar117._24_4_);
      auVar132._24_4_ = fVar201;
      auVar132._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar117._28_4_;
      auVar117 = vblendmps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar5));
      auVar133._0_4_ =
           (float)((uint)(bVar90 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar107._0_4_)
      ;
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar133._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar107._4_4_);
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar133._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar107._8_4_);
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar133._12_4_ = (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar107._12_4_);
      fVar204 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar117._16_4_);
      auVar133._16_4_ = fVar204;
      fVar203 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar117._20_4_);
      auVar133._20_4_ = fVar203;
      fVar202 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar117._24_4_);
      auVar133._24_4_ = fVar202;
      iVar2 = (uint)(byte)(uVar91 >> 7) * auVar117._28_4_;
      auVar133._28_4_ = iVar2;
      auVar134._0_4_ =
           (uint)(bVar90 & 1) * (int)auVar157._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar119._0_4_;
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar14 * (int)auVar157._4_4_ | (uint)!bVar14 * auVar119._4_4_;
      bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar14 * (int)auVar157._8_4_ | (uint)!bVar14 * auVar119._8_4_;
      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar14 * (int)auVar157._12_4_ | (uint)!bVar14 * auVar119._12_4_;
      auVar134._16_4_ = (uint)!(bool)((byte)(uVar91 >> 4) & 1) * auVar119._16_4_;
      auVar134._20_4_ = (uint)!(bool)((byte)(uVar91 >> 5) & 1) * auVar119._20_4_;
      auVar134._24_4_ = (uint)!(bool)((byte)(uVar91 >> 6) & 1) * auVar119._24_4_;
      auVar134._28_4_ = (uint)!SUB81(uVar91 >> 7,0) * auVar119._28_4_;
      bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar91 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
      bVar15 = (bool)((byte)(uVar91 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar120 = vsubps_avx512vl(auVar134,auVar124);
      auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar181._12_4_ |
                                               (uint)!bVar18 * auVar106._12_4_,
                                               CONCAT48((uint)bVar16 * (int)auVar181._8_4_ |
                                                        (uint)!bVar16 * auVar106._8_4_,
                                                        CONCAT44((uint)bVar14 * (int)auVar181._4_4_
                                                                 | (uint)!bVar14 * auVar106._4_4_,
                                                                 (uint)(bVar90 & 1) *
                                                                 (int)auVar181._0_4_ |
                                                                 (uint)!(bool)(bVar90 & 1) *
                                                                 auVar106._0_4_)))),auVar123);
      auVar215 = ZEXT3264(auVar115);
      auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar108._12_4_ |
                                               (uint)!bVar19 * auVar5._12_4_,
                                               CONCAT48((uint)bVar17 * (int)auVar108._8_4_ |
                                                        (uint)!bVar17 * auVar5._8_4_,
                                                        CONCAT44((uint)bVar15 * (int)auVar108._4_4_
                                                                 | (uint)!bVar15 * auVar5._4_4_,
                                                                 (uint)(bVar90 & 1) *
                                                                 (int)auVar108._0_4_ |
                                                                 (uint)!(bool)(bVar90 & 1) *
                                                                 auVar5._0_4_)))),auVar130);
      auVar125 = vsubps_avx(auVar124,auVar131);
      auVar220 = ZEXT3264(auVar125);
      auVar119 = vsubps_avx(auVar123,auVar132);
      auVar118 = vsubps_avx(auVar130,auVar133);
      auVar51._4_4_ = auVar116._4_4_ * fVar150;
      auVar51._0_4_ = auVar116._0_4_ * fVar103;
      auVar51._8_4_ = auVar116._8_4_ * fVar152;
      auVar51._12_4_ = auVar116._12_4_ * fVar154;
      auVar51._16_4_ = auVar116._16_4_ * 0.0;
      auVar51._20_4_ = auVar116._20_4_ * 0.0;
      auVar51._24_4_ = auVar116._24_4_ * 0.0;
      auVar51._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar51,auVar130,auVar120);
      auVar197._0_4_ = fVar104 * auVar120._0_4_;
      auVar197._4_4_ = fVar151 * auVar120._4_4_;
      auVar197._8_4_ = fVar153 * auVar120._8_4_;
      auVar197._12_4_ = fVar155 * auVar120._12_4_;
      auVar197._16_4_ = auVar120._16_4_ * 0.0;
      auVar197._20_4_ = auVar120._20_4_ * 0.0;
      auVar197._24_4_ = auVar120._24_4_ * 0.0;
      auVar197._28_4_ = 0;
      auVar107 = vfmsub231ps_fma(auVar197,auVar124,auVar115);
      auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar112,ZEXT1632(auVar109));
      auVar206._0_4_ = auVar115._0_4_ * auVar130._0_4_;
      auVar206._4_4_ = auVar115._4_4_ * auVar130._4_4_;
      auVar206._8_4_ = auVar115._8_4_ * auVar130._8_4_;
      auVar206._12_4_ = auVar115._12_4_ * auVar130._12_4_;
      auVar206._16_4_ = auVar115._16_4_ * fVar176;
      auVar206._20_4_ = auVar115._20_4_ * fVar175;
      auVar206._24_4_ = auVar115._24_4_ * fVar177;
      auVar206._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar206,auVar123,auVar116);
      auVar121 = vfmadd231ps_avx512vl(auVar117,auVar112,ZEXT1632(auVar109));
      auVar117 = vmulps_avx512vl(auVar118,auVar131);
      auVar117 = vfmsub231ps_avx512vl(auVar117,auVar125,auVar133);
      auVar52._4_4_ = auVar119._4_4_ * auVar133._4_4_;
      auVar52._0_4_ = auVar119._0_4_ * auVar133._0_4_;
      auVar52._8_4_ = auVar119._8_4_ * auVar133._8_4_;
      auVar52._12_4_ = auVar119._12_4_ * auVar133._12_4_;
      auVar52._16_4_ = auVar119._16_4_ * fVar204;
      auVar52._20_4_ = auVar119._20_4_ * fVar203;
      auVar52._24_4_ = auVar119._24_4_ * fVar202;
      auVar52._28_4_ = iVar2;
      auVar109 = vfmsub231ps_fma(auVar52,auVar132,auVar118);
      auVar207._0_4_ = auVar132._0_4_ * auVar125._0_4_;
      auVar207._4_4_ = auVar132._4_4_ * auVar125._4_4_;
      auVar207._8_4_ = auVar132._8_4_ * auVar125._8_4_;
      auVar207._12_4_ = auVar132._12_4_ * auVar125._12_4_;
      auVar207._16_4_ = fVar188 * auVar125._16_4_;
      auVar207._20_4_ = fVar189 * auVar125._20_4_;
      auVar207._24_4_ = fVar201 * auVar125._24_4_;
      auVar207._28_4_ = 0;
      auVar107 = vfmsub231ps_fma(auVar207,auVar119,auVar131);
      auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar112,auVar117);
      auVar113 = vfmadd231ps_avx512vl(auVar117,auVar112,ZEXT1632(auVar109));
      auVar210 = ZEXT3264(auVar113);
      auVar117 = vmaxps_avx(auVar121,auVar113);
      uVar28 = vcmpps_avx512vl(auVar117,auVar112,2);
      bVar101 = bVar101 & (byte)uVar28;
      if (bVar101 != 0) {
        auVar53._4_4_ = auVar118._4_4_ * auVar115._4_4_;
        auVar53._0_4_ = auVar118._0_4_ * auVar115._0_4_;
        auVar53._8_4_ = auVar118._8_4_ * auVar115._8_4_;
        auVar53._12_4_ = auVar118._12_4_ * auVar115._12_4_;
        auVar53._16_4_ = auVar118._16_4_ * auVar115._16_4_;
        auVar53._20_4_ = auVar118._20_4_ * auVar115._20_4_;
        auVar53._24_4_ = auVar118._24_4_ * auVar115._24_4_;
        auVar53._28_4_ = auVar117._28_4_;
        auVar5 = vfmsub231ps_fma(auVar53,auVar119,auVar116);
        auVar54._4_4_ = auVar116._4_4_ * auVar125._4_4_;
        auVar54._0_4_ = auVar116._0_4_ * auVar125._0_4_;
        auVar54._8_4_ = auVar116._8_4_ * auVar125._8_4_;
        auVar54._12_4_ = auVar116._12_4_ * auVar125._12_4_;
        auVar54._16_4_ = auVar116._16_4_ * auVar125._16_4_;
        auVar54._20_4_ = auVar116._20_4_ * auVar125._20_4_;
        auVar54._24_4_ = auVar116._24_4_ * auVar125._24_4_;
        auVar54._28_4_ = auVar116._28_4_;
        auVar106 = vfmsub231ps_fma(auVar54,auVar120,auVar118);
        auVar55._4_4_ = auVar119._4_4_ * auVar120._4_4_;
        auVar55._0_4_ = auVar119._0_4_ * auVar120._0_4_;
        auVar55._8_4_ = auVar119._8_4_ * auVar120._8_4_;
        auVar55._12_4_ = auVar119._12_4_ * auVar120._12_4_;
        auVar55._16_4_ = auVar119._16_4_ * auVar120._16_4_;
        auVar55._20_4_ = auVar119._20_4_ * auVar120._20_4_;
        auVar55._24_4_ = auVar119._24_4_ * auVar120._24_4_;
        auVar55._28_4_ = auVar119._28_4_;
        auVar7 = vfmsub231ps_fma(auVar55,auVar125,auVar115);
        auVar109 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar106),ZEXT1632(auVar7));
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar5),ZEXT1232(ZEXT412(0)) << 0x20)
        ;
        auVar117 = vrcp14ps_avx512vl(ZEXT1632(auVar107));
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar33._16_4_ = 0x3f800000;
        auVar33._20_4_ = 0x3f800000;
        auVar33._24_4_ = 0x3f800000;
        auVar33._28_4_ = 0x3f800000;
        auVar115 = vfnmadd213ps_avx512vl(auVar117,ZEXT1632(auVar107),auVar33);
        auVar109 = vfmadd132ps_fma(auVar115,auVar117,auVar117);
        auVar215 = ZEXT1664(auVar109);
        auVar56._4_4_ = auVar7._4_4_ * auVar130._4_4_;
        auVar56._0_4_ = auVar7._0_4_ * auVar130._0_4_;
        auVar56._8_4_ = auVar7._8_4_ * auVar130._8_4_;
        auVar56._12_4_ = auVar7._12_4_ * auVar130._12_4_;
        auVar56._16_4_ = fVar176 * 0.0;
        auVar56._20_4_ = fVar175 * 0.0;
        auVar56._24_4_ = fVar177 * 0.0;
        auVar56._28_4_ = iVar1;
        auVar106 = vfmadd231ps_fma(auVar56,auVar123,ZEXT1632(auVar106));
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar124,ZEXT1632(auVar5));
        fVar175 = auVar109._0_4_;
        fVar176 = auVar109._4_4_;
        fVar177 = auVar109._8_4_;
        fVar188 = auVar109._12_4_;
        local_5a0._28_4_ = auVar117._28_4_;
        local_5a0._0_28_ =
             ZEXT1628(CONCAT412(auVar106._12_4_ * fVar188,
                                CONCAT48(auVar106._8_4_ * fVar177,
                                         CONCAT44(auVar106._4_4_ * fVar176,auVar106._0_4_ * fVar175)
                                        )));
        auVar220 = ZEXT3264(local_5a0);
        auVar163._4_4_ = local_760;
        auVar163._0_4_ = local_760;
        auVar163._8_4_ = local_760;
        auVar163._12_4_ = local_760;
        auVar163._16_4_ = local_760;
        auVar163._20_4_ = local_760;
        auVar163._24_4_ = local_760;
        auVar163._28_4_ = local_760;
        uVar28 = vcmpps_avx512vl(auVar163,local_5a0,2);
        uVar178 = *(undefined4 *)(ray + sVar100 * 4 + 0x200);
        auVar34._4_4_ = uVar178;
        auVar34._0_4_ = uVar178;
        auVar34._8_4_ = uVar178;
        auVar34._12_4_ = uVar178;
        auVar34._16_4_ = uVar178;
        auVar34._20_4_ = uVar178;
        auVar34._24_4_ = uVar178;
        auVar34._28_4_ = uVar178;
        uVar30 = vcmpps_avx512vl(local_5a0,auVar34,2);
        bVar101 = (byte)uVar28 & (byte)uVar30 & bVar101;
        if (bVar101 != 0) {
          uVar102 = vcmpps_avx512vl(ZEXT1632(auVar107),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar102 = bVar101 & uVar102;
          if ((char)uVar102 != '\0') {
            fVar189 = auVar121._0_4_ * fVar175;
            fVar201 = auVar121._4_4_ * fVar176;
            auVar57._4_4_ = fVar201;
            auVar57._0_4_ = fVar189;
            fVar202 = auVar121._8_4_ * fVar177;
            auVar57._8_4_ = fVar202;
            fVar203 = auVar121._12_4_ * fVar188;
            auVar57._12_4_ = fVar203;
            fVar204 = auVar121._16_4_ * 0.0;
            auVar57._16_4_ = fVar204;
            fVar103 = auVar121._20_4_ * 0.0;
            auVar57._20_4_ = fVar103;
            fVar104 = auVar121._24_4_ * 0.0;
            auVar57._24_4_ = fVar104;
            auVar57._28_4_ = auVar121._28_4_;
            auVar164._8_4_ = 0x3f800000;
            auVar164._0_8_ = 0x3f8000003f800000;
            auVar164._12_4_ = 0x3f800000;
            auVar164._16_4_ = 0x3f800000;
            auVar164._20_4_ = 0x3f800000;
            auVar164._24_4_ = 0x3f800000;
            auVar164._28_4_ = 0x3f800000;
            auVar117 = vsubps_avx(auVar164,auVar57);
            local_5e0._0_4_ =
                 (float)((uint)(bVar90 & 1) * (int)fVar189 |
                        (uint)!(bool)(bVar90 & 1) * auVar117._0_4_);
            bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar14 * (int)fVar201 | (uint)!bVar14 * auVar117._4_4_);
            bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar14 * (int)fVar202 | (uint)!bVar14 * auVar117._8_4_);
            bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
            local_5e0._12_4_ =
                 (float)((uint)bVar14 * (int)fVar203 | (uint)!bVar14 * auVar117._12_4_);
            bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar14 * (int)fVar204 | (uint)!bVar14 * auVar117._16_4_);
            bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar14 * (int)fVar103 | (uint)!bVar14 * auVar117._20_4_);
            bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar14 * (int)fVar104 | (uint)!bVar14 * auVar117._24_4_);
            bVar14 = SUB81(uVar91 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar117._28_4_);
            auVar117 = vsubps_avx(auVar111,auVar114);
            auVar109 = vfmadd213ps_fma(auVar117,local_5e0,auVar114);
            uVar178 = *(undefined4 *)((long)local_7f8->ray_space + sVar100 * 4 + -0x40);
            auVar35._4_4_ = uVar178;
            auVar35._0_4_ = uVar178;
            auVar35._8_4_ = uVar178;
            auVar35._12_4_ = uVar178;
            auVar35._16_4_ = uVar178;
            auVar35._20_4_ = uVar178;
            auVar35._24_4_ = uVar178;
            auVar35._28_4_ = uVar178;
            auVar117 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar109._12_4_ + auVar109._12_4_,
                                                          CONCAT48(auVar109._8_4_ + auVar109._8_4_,
                                                                   CONCAT44(auVar109._4_4_ +
                                                                            auVar109._4_4_,
                                                                            auVar109._0_4_ +
                                                                            auVar109._0_4_)))),
                                       auVar35);
            uVar29 = vcmpps_avx512vl(local_5a0,auVar117,6);
            uVar102 = uVar102 & uVar29;
            bVar101 = (byte)uVar102;
            if (bVar101 != 0) {
              auVar186._0_4_ = auVar113._0_4_ * fVar175;
              auVar186._4_4_ = auVar113._4_4_ * fVar176;
              auVar186._8_4_ = auVar113._8_4_ * fVar177;
              auVar186._12_4_ = auVar113._12_4_ * fVar188;
              auVar186._16_4_ = auVar113._16_4_ * 0.0;
              auVar186._20_4_ = auVar113._20_4_ * 0.0;
              auVar186._24_4_ = auVar113._24_4_ * 0.0;
              auVar186._28_4_ = 0;
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = 0x3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar117 = vsubps_avx(auVar198,auVar186);
              auVar135._0_4_ =
                   (uint)(bVar90 & 1) * (int)auVar186._0_4_ |
                   (uint)!(bool)(bVar90 & 1) * auVar117._0_4_;
              bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
              auVar135._4_4_ = (uint)bVar14 * (int)auVar186._4_4_ | (uint)!bVar14 * auVar117._4_4_;
              bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
              auVar135._8_4_ = (uint)bVar14 * (int)auVar186._8_4_ | (uint)!bVar14 * auVar117._8_4_;
              bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
              auVar135._12_4_ =
                   (uint)bVar14 * (int)auVar186._12_4_ | (uint)!bVar14 * auVar117._12_4_;
              bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
              auVar135._16_4_ =
                   (uint)bVar14 * (int)auVar186._16_4_ | (uint)!bVar14 * auVar117._16_4_;
              bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
              auVar135._20_4_ =
                   (uint)bVar14 * (int)auVar186._20_4_ | (uint)!bVar14 * auVar117._20_4_;
              bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
              auVar135._24_4_ =
                   (uint)bVar14 * (int)auVar186._24_4_ | (uint)!bVar14 * auVar117._24_4_;
              auVar135._28_4_ = (uint)!SUB81(uVar91 >> 7,0) * auVar117._28_4_;
              auVar36._8_4_ = 0x40000000;
              auVar36._0_8_ = 0x4000000040000000;
              auVar36._12_4_ = 0x40000000;
              auVar36._16_4_ = 0x40000000;
              auVar36._20_4_ = 0x40000000;
              auVar36._24_4_ = 0x40000000;
              auVar36._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar135,auVar198,auVar36);
              local_580 = 0;
              local_570 = local_860;
              uStack_568 = uStack_858;
              local_560 = local_880;
              uStack_558 = uStack_878;
              local_550 = local_890;
              uStack_548 = uStack_888;
              local_540 = local_870;
              uStack_538 = uStack_868;
              if ((pGVar96->mask & *(uint *)(ray + sVar100 * 4 + 0x240)) != 0) {
                fVar180 = 1.0 / auVar226._0_4_;
                local_520[0] = fVar180 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar180 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar180 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar180 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar180 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar180 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar180 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                auVar165._8_4_ = 0x7f800000;
                auVar165._0_8_ = 0x7f8000007f800000;
                auVar165._12_4_ = 0x7f800000;
                auVar165._16_4_ = 0x7f800000;
                auVar165._20_4_ = 0x7f800000;
                auVar165._24_4_ = 0x7f800000;
                auVar165._28_4_ = 0x7f800000;
                auVar117 = vblendmps_avx512vl(auVar165,local_5a0);
                auVar136._0_4_ =
                     (uint)(bVar101 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                auVar136._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                auVar136._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                auVar136._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
                auVar136._16_4_ = (uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
                auVar136._20_4_ = (uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
                auVar136._24_4_ = (uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = SUB81(uVar102 >> 7,0);
                auVar136._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * 0x7f800000;
                auVar117 = vshufps_avx(auVar136,auVar136,0xb1);
                auVar117 = vminps_avx(auVar136,auVar117);
                auVar115 = vshufpd_avx(auVar117,auVar117,5);
                auVar117 = vminps_avx(auVar117,auVar115);
                auVar115 = vpermpd_avx2(auVar117,0x4e);
                auVar117 = vminps_avx(auVar117,auVar115);
                uVar28 = vcmpps_avx512vl(auVar136,auVar117,0);
                uVar93 = (uint)uVar102;
                if ((bVar101 & (byte)uVar28) != 0) {
                  uVar93 = (uint)(bVar101 & (byte)uVar28);
                }
                uVar31 = 0;
                for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                  uVar31 = uVar31 + 1;
                }
                uVar91 = (ulong)uVar31;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780 = *(float *)(ray + sVar100 * 4 + 0x200);
                  fStack_77c = 0.0;
                  fStack_778 = 0.0;
                  fStack_774 = 0.0;
                  local_7e0 = local_5a0;
                  local_57c = iVar11;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar91]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar91 * 4)));
                    *(undefined4 *)(ray + sVar100 * 4 + 0x200) =
                         *(undefined4 *)(local_4e0 + uVar91 * 4);
                    local_850.context = context->user;
                    fVar177 = local_200._0_4_;
                    fVar175 = 1.0 - fVar177;
                    fVar180 = fVar175 * fVar175 * -3.0;
                    auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar175)),
                                               ZEXT416((uint)(fVar177 * fVar175)),
                                               ZEXT416(0xc0000000));
                    auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar177 * fVar175)),
                                               ZEXT416((uint)(fVar177 * fVar177)),
                                               ZEXT416(0x40000000));
                    fVar175 = auVar109._0_4_ * 3.0;
                    fVar176 = auVar107._0_4_ * 3.0;
                    fVar177 = fVar177 * fVar177 * 3.0;
                    auVar214._0_4_ = fVar177 * fVar156;
                    auVar214._4_4_ = fVar177 * fVar172;
                    auVar214._8_4_ = fVar177 * fVar173;
                    auVar214._12_4_ = fVar177 * fVar174;
                    auVar160._4_4_ = fVar176;
                    auVar160._0_4_ = fVar176;
                    auVar160._8_4_ = fVar176;
                    auVar160._12_4_ = fVar176;
                    auVar109 = vfmadd132ps_fma(auVar160,auVar214,auVar6);
                    auVar195._4_4_ = fVar175;
                    auVar195._0_4_ = fVar175;
                    auVar195._8_4_ = fVar175;
                    auVar195._12_4_ = fVar175;
                    auVar109 = vfmadd132ps_fma(auVar195,auVar109,auVar32);
                    auVar161._4_4_ = fVar180;
                    auVar161._0_4_ = fVar180;
                    auVar161._8_4_ = fVar180;
                    auVar161._12_4_ = fVar180;
                    auVar109 = vfmadd132ps_fma(auVar161,auVar109,auVar105);
                    auVar171 = vbroadcastss_avx512f(auVar109);
                    auVar210 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar210 = vpermps_avx512f(auVar210,ZEXT1664(auVar109));
                    auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar215,ZEXT1664(auVar109));
                    local_2c0[0] = (RTCHitN)auVar171[0];
                    local_2c0[1] = (RTCHitN)auVar171[1];
                    local_2c0[2] = (RTCHitN)auVar171[2];
                    local_2c0[3] = (RTCHitN)auVar171[3];
                    local_2c0[4] = (RTCHitN)auVar171[4];
                    local_2c0[5] = (RTCHitN)auVar171[5];
                    local_2c0[6] = (RTCHitN)auVar171[6];
                    local_2c0[7] = (RTCHitN)auVar171[7];
                    local_2c0[8] = (RTCHitN)auVar171[8];
                    local_2c0[9] = (RTCHitN)auVar171[9];
                    local_2c0[10] = (RTCHitN)auVar171[10];
                    local_2c0[0xb] = (RTCHitN)auVar171[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar171[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar171[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar171[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar171[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar171[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar171[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar171[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar171[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar171[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar171[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar171[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar171[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar171[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar171[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar171[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar171[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar171[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar171[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar171[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar171[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar171[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar171[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar171[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar171[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar171[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar171[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar171[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar171[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar171[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar171[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar171[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar171[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar171[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar171[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar171[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar171[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar171[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar171[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar171[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar171[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar171[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar171[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar171[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar171[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar171[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar171[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar171[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar171[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar171[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar171[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar171[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar171[0x3f];
                    local_280 = auVar210;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar171 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar171);
                    auVar117 = vpcmpeqd_avx2(auVar171._0_32_,auVar171._0_32_);
                    local_800[3] = auVar117;
                    local_800[2] = auVar117;
                    local_800[1] = auVar117;
                    *local_800 = auVar117;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]));
                    auVar171 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar171);
                    local_850.valid = (int *)local_740;
                    local_850.geometryUserPtr = pGVar96->userPtr;
                    local_850.hit = local_2c0;
                    local_850.N = 0x10;
                    local_850.ray = (RTCRayN *)ray;
                    if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar210 = ZEXT1664(auVar210._0_16_);
                      auVar215 = ZEXT1664(auVar215._0_16_);
                      (*pGVar96->intersectionFilterN)(&local_850);
                      auVar220 = ZEXT3264(local_7e0);
                      auVar237 = ZEXT3264(local_7a0);
                      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar236 = ZEXT1664(auVar109);
                      auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar235 = ZEXT3264(auVar117);
                      auVar171 = vmovdqa64_avx512f(local_740);
                      sVar100 = local_808;
                    }
                    uVar28 = vptestmd_avx512f(auVar171,auVar171);
                    if ((short)uVar28 == 0) {
LAB_01a26092:
                      *(float *)(ray + sVar100 * 4 + 0x200) = local_780;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        auVar215 = ZEXT1664(auVar215._0_16_);
                        (*p_Var13)(&local_850);
                        auVar220 = ZEXT3264(local_7e0);
                        auVar237 = ZEXT3264(local_7a0);
                        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar236 = ZEXT1664(auVar109);
                        auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar235 = ZEXT3264(auVar117);
                        auVar171 = vmovdqa64_avx512f(local_740);
                        sVar100 = local_808;
                      }
                      uVar29 = vptestmd_avx512f(auVar171,auVar171);
                      if ((short)uVar29 == 0) goto LAB_01a26092;
                      iVar1 = *(int *)(local_850.hit + 4);
                      iVar2 = *(int *)(local_850.hit + 8);
                      iVar75 = *(int *)(local_850.hit + 0xc);
                      iVar76 = *(int *)(local_850.hit + 0x10);
                      iVar77 = *(int *)(local_850.hit + 0x14);
                      iVar78 = *(int *)(local_850.hit + 0x18);
                      iVar79 = *(int *)(local_850.hit + 0x1c);
                      iVar80 = *(int *)(local_850.hit + 0x20);
                      iVar81 = *(int *)(local_850.hit + 0x24);
                      iVar82 = *(int *)(local_850.hit + 0x28);
                      iVar83 = *(int *)(local_850.hit + 0x2c);
                      iVar84 = *(int *)(local_850.hit + 0x30);
                      iVar85 = *(int *)(local_850.hit + 0x34);
                      iVar86 = *(int *)(local_850.hit + 0x38);
                      iVar87 = *(int *)(local_850.hit + 0x3c);
                      bVar101 = (byte)uVar29;
                      bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar90 = (byte)(uVar29 >> 8);
                      bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar27 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x300) =
                           (uint)(bVar101 & 1) * *(int *)local_850.hit |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x300);
                      *(uint *)(local_850.ray + 0x304) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_850.ray + 0x304);
                      *(uint *)(local_850.ray + 0x308) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_850.ray + 0x308);
                      *(uint *)(local_850.ray + 0x30c) =
                           (uint)bVar16 * iVar75 | (uint)!bVar16 * *(int *)(local_850.ray + 0x30c);
                      *(uint *)(local_850.ray + 0x310) =
                           (uint)bVar17 * iVar76 | (uint)!bVar17 * *(int *)(local_850.ray + 0x310);
                      *(uint *)(local_850.ray + 0x314) =
                           (uint)bVar18 * iVar77 | (uint)!bVar18 * *(int *)(local_850.ray + 0x314);
                      *(uint *)(local_850.ray + 0x318) =
                           (uint)bVar19 * iVar78 | (uint)!bVar19 * *(int *)(local_850.ray + 0x318);
                      *(uint *)(local_850.ray + 0x31c) =
                           (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_850.ray + 0x31c);
                      *(uint *)(local_850.ray + 800) =
                           (uint)(bVar90 & 1) * iVar80 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 800);
                      *(uint *)(local_850.ray + 0x324) =
                           (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_850.ray + 0x324);
                      *(uint *)(local_850.ray + 0x328) =
                           (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_850.ray + 0x328);
                      *(uint *)(local_850.ray + 0x32c) =
                           (uint)bVar23 * iVar83 | (uint)!bVar23 * *(int *)(local_850.ray + 0x32c);
                      *(uint *)(local_850.ray + 0x330) =
                           (uint)bVar24 * iVar84 | (uint)!bVar24 * *(int *)(local_850.ray + 0x330);
                      *(uint *)(local_850.ray + 0x334) =
                           (uint)bVar25 * iVar85 | (uint)!bVar25 * *(int *)(local_850.ray + 0x334);
                      *(uint *)(local_850.ray + 0x338) =
                           (uint)bVar26 * iVar86 | (uint)!bVar26 * *(int *)(local_850.ray + 0x338);
                      *(uint *)(local_850.ray + 0x33c) =
                           (uint)bVar27 * iVar87 | (uint)!bVar27 * *(int *)(local_850.ray + 0x33c);
                      iVar1 = *(int *)(local_850.hit + 0x44);
                      iVar2 = *(int *)(local_850.hit + 0x48);
                      iVar75 = *(int *)(local_850.hit + 0x4c);
                      iVar76 = *(int *)(local_850.hit + 0x50);
                      iVar77 = *(int *)(local_850.hit + 0x54);
                      iVar78 = *(int *)(local_850.hit + 0x58);
                      iVar79 = *(int *)(local_850.hit + 0x5c);
                      iVar80 = *(int *)(local_850.hit + 0x60);
                      iVar81 = *(int *)(local_850.hit + 100);
                      iVar82 = *(int *)(local_850.hit + 0x68);
                      iVar83 = *(int *)(local_850.hit + 0x6c);
                      iVar84 = *(int *)(local_850.hit + 0x70);
                      iVar85 = *(int *)(local_850.hit + 0x74);
                      iVar86 = *(int *)(local_850.hit + 0x78);
                      iVar87 = *(int *)(local_850.hit + 0x7c);
                      bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar27 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x340) =
                           (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0x40) |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x340);
                      *(uint *)(local_850.ray + 0x344) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_850.ray + 0x344);
                      *(uint *)(local_850.ray + 0x348) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_850.ray + 0x348);
                      *(uint *)(local_850.ray + 0x34c) =
                           (uint)bVar16 * iVar75 | (uint)!bVar16 * *(int *)(local_850.ray + 0x34c);
                      *(uint *)(local_850.ray + 0x350) =
                           (uint)bVar17 * iVar76 | (uint)!bVar17 * *(int *)(local_850.ray + 0x350);
                      *(uint *)(local_850.ray + 0x354) =
                           (uint)bVar18 * iVar77 | (uint)!bVar18 * *(int *)(local_850.ray + 0x354);
                      *(uint *)(local_850.ray + 0x358) =
                           (uint)bVar19 * iVar78 | (uint)!bVar19 * *(int *)(local_850.ray + 0x358);
                      *(uint *)(local_850.ray + 0x35c) =
                           (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_850.ray + 0x35c);
                      *(uint *)(local_850.ray + 0x360) =
                           (uint)(bVar90 & 1) * iVar80 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x360);
                      *(uint *)(local_850.ray + 0x364) =
                           (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_850.ray + 0x364);
                      *(uint *)(local_850.ray + 0x368) =
                           (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_850.ray + 0x368);
                      *(uint *)(local_850.ray + 0x36c) =
                           (uint)bVar23 * iVar83 | (uint)!bVar23 * *(int *)(local_850.ray + 0x36c);
                      *(uint *)(local_850.ray + 0x370) =
                           (uint)bVar24 * iVar84 | (uint)!bVar24 * *(int *)(local_850.ray + 0x370);
                      *(uint *)(local_850.ray + 0x374) =
                           (uint)bVar25 * iVar85 | (uint)!bVar25 * *(int *)(local_850.ray + 0x374);
                      *(uint *)(local_850.ray + 0x378) =
                           (uint)bVar26 * iVar86 | (uint)!bVar26 * *(int *)(local_850.ray + 0x378);
                      *(uint *)(local_850.ray + 0x37c) =
                           (uint)bVar27 * iVar87 | (uint)!bVar27 * *(int *)(local_850.ray + 0x37c);
                      iVar1 = *(int *)(local_850.hit + 0x84);
                      iVar2 = *(int *)(local_850.hit + 0x88);
                      iVar75 = *(int *)(local_850.hit + 0x8c);
                      iVar76 = *(int *)(local_850.hit + 0x90);
                      iVar77 = *(int *)(local_850.hit + 0x94);
                      iVar78 = *(int *)(local_850.hit + 0x98);
                      iVar79 = *(int *)(local_850.hit + 0x9c);
                      iVar80 = *(int *)(local_850.hit + 0xa0);
                      iVar81 = *(int *)(local_850.hit + 0xa4);
                      iVar82 = *(int *)(local_850.hit + 0xa8);
                      iVar83 = *(int *)(local_850.hit + 0xac);
                      iVar84 = *(int *)(local_850.hit + 0xb0);
                      iVar85 = *(int *)(local_850.hit + 0xb4);
                      iVar86 = *(int *)(local_850.hit + 0xb8);
                      iVar87 = *(int *)(local_850.hit + 0xbc);
                      bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar27 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x380) =
                           (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0x80) |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x380);
                      *(uint *)(local_850.ray + 900) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_850.ray + 900);
                      *(uint *)(local_850.ray + 0x388) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_850.ray + 0x388);
                      *(uint *)(local_850.ray + 0x38c) =
                           (uint)bVar16 * iVar75 | (uint)!bVar16 * *(int *)(local_850.ray + 0x38c);
                      *(uint *)(local_850.ray + 0x390) =
                           (uint)bVar17 * iVar76 | (uint)!bVar17 * *(int *)(local_850.ray + 0x390);
                      *(uint *)(local_850.ray + 0x394) =
                           (uint)bVar18 * iVar77 | (uint)!bVar18 * *(int *)(local_850.ray + 0x394);
                      *(uint *)(local_850.ray + 0x398) =
                           (uint)bVar19 * iVar78 | (uint)!bVar19 * *(int *)(local_850.ray + 0x398);
                      *(uint *)(local_850.ray + 0x39c) =
                           (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_850.ray + 0x39c);
                      *(uint *)(local_850.ray + 0x3a0) =
                           (uint)(bVar90 & 1) * iVar80 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x3a0);
                      *(uint *)(local_850.ray + 0x3a4) =
                           (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_850.ray + 0x3a4);
                      *(uint *)(local_850.ray + 0x3a8) =
                           (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_850.ray + 0x3a8);
                      *(uint *)(local_850.ray + 0x3ac) =
                           (uint)bVar23 * iVar83 | (uint)!bVar23 * *(int *)(local_850.ray + 0x3ac);
                      *(uint *)(local_850.ray + 0x3b0) =
                           (uint)bVar24 * iVar84 | (uint)!bVar24 * *(int *)(local_850.ray + 0x3b0);
                      *(uint *)(local_850.ray + 0x3b4) =
                           (uint)bVar25 * iVar85 | (uint)!bVar25 * *(int *)(local_850.ray + 0x3b4);
                      *(uint *)(local_850.ray + 0x3b8) =
                           (uint)bVar26 * iVar86 | (uint)!bVar26 * *(int *)(local_850.ray + 0x3b8);
                      *(uint *)(local_850.ray + 0x3bc) =
                           (uint)bVar27 * iVar87 | (uint)!bVar27 * *(int *)(local_850.ray + 0x3bc);
                      iVar1 = *(int *)(local_850.hit + 0xc4);
                      iVar2 = *(int *)(local_850.hit + 200);
                      iVar75 = *(int *)(local_850.hit + 0xcc);
                      iVar76 = *(int *)(local_850.hit + 0xd0);
                      iVar77 = *(int *)(local_850.hit + 0xd4);
                      iVar78 = *(int *)(local_850.hit + 0xd8);
                      iVar79 = *(int *)(local_850.hit + 0xdc);
                      iVar80 = *(int *)(local_850.hit + 0xe0);
                      iVar81 = *(int *)(local_850.hit + 0xe4);
                      iVar82 = *(int *)(local_850.hit + 0xe8);
                      iVar83 = *(int *)(local_850.hit + 0xec);
                      iVar84 = *(int *)(local_850.hit + 0xf0);
                      iVar85 = *(int *)(local_850.hit + 0xf4);
                      iVar86 = *(int *)(local_850.hit + 0xf8);
                      iVar87 = *(int *)(local_850.hit + 0xfc);
                      bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar27 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x3c0) =
                           (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0xc0) |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x3c0);
                      *(uint *)(local_850.ray + 0x3c4) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_850.ray + 0x3c4);
                      *(uint *)(local_850.ray + 0x3c8) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_850.ray + 0x3c8);
                      *(uint *)(local_850.ray + 0x3cc) =
                           (uint)bVar16 * iVar75 | (uint)!bVar16 * *(int *)(local_850.ray + 0x3cc);
                      *(uint *)(local_850.ray + 0x3d0) =
                           (uint)bVar17 * iVar76 | (uint)!bVar17 * *(int *)(local_850.ray + 0x3d0);
                      *(uint *)(local_850.ray + 0x3d4) =
                           (uint)bVar18 * iVar77 | (uint)!bVar18 * *(int *)(local_850.ray + 0x3d4);
                      *(uint *)(local_850.ray + 0x3d8) =
                           (uint)bVar19 * iVar78 | (uint)!bVar19 * *(int *)(local_850.ray + 0x3d8);
                      *(uint *)(local_850.ray + 0x3dc) =
                           (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_850.ray + 0x3dc);
                      *(uint *)(local_850.ray + 0x3e0) =
                           (uint)(bVar90 & 1) * iVar80 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x3e0);
                      *(uint *)(local_850.ray + 0x3e4) =
                           (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_850.ray + 0x3e4);
                      *(uint *)(local_850.ray + 1000) =
                           (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_850.ray + 1000);
                      *(uint *)(local_850.ray + 0x3ec) =
                           (uint)bVar23 * iVar83 | (uint)!bVar23 * *(int *)(local_850.ray + 0x3ec);
                      *(uint *)(local_850.ray + 0x3f0) =
                           (uint)bVar24 * iVar84 | (uint)!bVar24 * *(int *)(local_850.ray + 0x3f0);
                      *(uint *)(local_850.ray + 0x3f4) =
                           (uint)bVar25 * iVar85 | (uint)!bVar25 * *(int *)(local_850.ray + 0x3f4);
                      *(uint *)(local_850.ray + 0x3f8) =
                           (uint)bVar26 * iVar86 | (uint)!bVar26 * *(int *)(local_850.ray + 0x3f8);
                      *(uint *)(local_850.ray + 0x3fc) =
                           (uint)bVar27 * iVar87 | (uint)!bVar27 * *(int *)(local_850.ray + 0x3fc);
                      iVar1 = *(int *)(local_850.hit + 0x104);
                      iVar2 = *(int *)(local_850.hit + 0x108);
                      iVar75 = *(int *)(local_850.hit + 0x10c);
                      iVar76 = *(int *)(local_850.hit + 0x110);
                      iVar77 = *(int *)(local_850.hit + 0x114);
                      iVar78 = *(int *)(local_850.hit + 0x118);
                      iVar79 = *(int *)(local_850.hit + 0x11c);
                      iVar80 = *(int *)(local_850.hit + 0x120);
                      iVar81 = *(int *)(local_850.hit + 0x124);
                      iVar82 = *(int *)(local_850.hit + 0x128);
                      iVar83 = *(int *)(local_850.hit + 300);
                      iVar84 = *(int *)(local_850.hit + 0x130);
                      iVar85 = *(int *)(local_850.hit + 0x134);
                      iVar86 = *(int *)(local_850.hit + 0x138);
                      iVar87 = *(int *)(local_850.hit + 0x13c);
                      bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar27 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x400) =
                           (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0x100) |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x400);
                      *(uint *)(local_850.ray + 0x404) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_850.ray + 0x404);
                      *(uint *)(local_850.ray + 0x408) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_850.ray + 0x408);
                      *(uint *)(local_850.ray + 0x40c) =
                           (uint)bVar16 * iVar75 | (uint)!bVar16 * *(int *)(local_850.ray + 0x40c);
                      *(uint *)(local_850.ray + 0x410) =
                           (uint)bVar17 * iVar76 | (uint)!bVar17 * *(int *)(local_850.ray + 0x410);
                      *(uint *)(local_850.ray + 0x414) =
                           (uint)bVar18 * iVar77 | (uint)!bVar18 * *(int *)(local_850.ray + 0x414);
                      *(uint *)(local_850.ray + 0x418) =
                           (uint)bVar19 * iVar78 | (uint)!bVar19 * *(int *)(local_850.ray + 0x418);
                      *(uint *)(local_850.ray + 0x41c) =
                           (uint)bVar20 * iVar79 | (uint)!bVar20 * *(int *)(local_850.ray + 0x41c);
                      *(uint *)(local_850.ray + 0x420) =
                           (uint)(bVar90 & 1) * iVar80 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x420);
                      *(uint *)(local_850.ray + 0x424) =
                           (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_850.ray + 0x424);
                      *(uint *)(local_850.ray + 0x428) =
                           (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_850.ray + 0x428);
                      *(uint *)(local_850.ray + 0x42c) =
                           (uint)bVar23 * iVar83 | (uint)!bVar23 * *(int *)(local_850.ray + 0x42c);
                      *(uint *)(local_850.ray + 0x430) =
                           (uint)bVar24 * iVar84 | (uint)!bVar24 * *(int *)(local_850.ray + 0x430);
                      *(uint *)(local_850.ray + 0x434) =
                           (uint)bVar25 * iVar85 | (uint)!bVar25 * *(int *)(local_850.ray + 0x434);
                      *(uint *)(local_850.ray + 0x438) =
                           (uint)bVar26 * iVar86 | (uint)!bVar26 * *(int *)(local_850.ray + 0x438);
                      *(uint *)(local_850.ray + 0x43c) =
                           (uint)bVar27 * iVar87 | (uint)!bVar27 * *(int *)(local_850.ray + 0x43c);
                      auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x140));
                      auVar171 = vmovdqu32_avx512f(auVar171);
                      *(undefined1 (*) [64])(local_850.ray + 0x440) = auVar171;
                      auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x180));
                      auVar171 = vmovdqu32_avx512f(auVar171);
                      *(undefined1 (*) [64])(local_850.ray + 0x480) = auVar171;
                      auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x1c0));
                      auVar171 = vmovdqa32_avx512f(auVar171);
                      *(undefined1 (*) [64])(local_850.ray + 0x4c0) = auVar171;
                      auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x200));
                      auVar171 = vmovdqa32_avx512f(auVar171);
                      *(undefined1 (*) [64])(local_850.ray + 0x500) = auVar171;
                      local_780 = *(float *)(ray + sVar100 * 4 + 0x200);
                      fStack_77c = 0.0;
                      fStack_778 = 0.0;
                      fStack_774 = 0.0;
                    }
                    bVar101 = ~(byte)(1 << ((uint)uVar91 & 0x1f)) & (byte)uVar102;
                    auVar169._4_4_ = local_780;
                    auVar169._0_4_ = local_780;
                    auVar169._8_4_ = local_780;
                    auVar169._12_4_ = local_780;
                    auVar169._16_4_ = local_780;
                    auVar169._20_4_ = local_780;
                    auVar169._24_4_ = local_780;
                    auVar169._28_4_ = local_780;
                    uVar28 = vcmpps_avx512vl(auVar220._0_32_,auVar169,2);
                    if ((bVar101 & (byte)uVar28) == 0) goto LAB_01a24fd1;
                    bVar101 = bVar101 & (byte)uVar28;
                    uVar102 = (ulong)bVar101;
                    auVar170._8_4_ = 0x7f800000;
                    auVar170._0_8_ = 0x7f8000007f800000;
                    auVar170._12_4_ = 0x7f800000;
                    auVar170._16_4_ = 0x7f800000;
                    auVar170._20_4_ = 0x7f800000;
                    auVar170._24_4_ = 0x7f800000;
                    auVar170._28_4_ = 0x7f800000;
                    auVar117 = vblendmps_avx512vl(auVar170,auVar220._0_32_);
                    auVar149._0_4_ =
                         (uint)(bVar101 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                    bVar14 = (bool)(bVar101 >> 1 & 1);
                    auVar149._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar101 >> 2 & 1);
                    auVar149._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar101 >> 3 & 1);
                    auVar149._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar101 >> 4 & 1);
                    auVar149._16_4_ = (uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar101 >> 5 & 1);
                    auVar149._20_4_ = (uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar101 >> 6 & 1);
                    auVar149._24_4_ = (uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar149._28_4_ =
                         (uint)(bVar101 >> 7) * auVar117._28_4_ |
                         (uint)!(bool)(bVar101 >> 7) * 0x7f800000;
                    auVar117 = vshufps_avx(auVar149,auVar149,0xb1);
                    auVar117 = vminps_avx(auVar149,auVar117);
                    auVar115 = vshufpd_avx(auVar117,auVar117,5);
                    auVar117 = vminps_avx(auVar117,auVar115);
                    auVar115 = vpermpd_avx2(auVar117,0x4e);
                    auVar117 = vminps_avx(auVar117,auVar115);
                    uVar28 = vcmpps_avx512vl(auVar149,auVar117,0);
                    bVar90 = (byte)uVar28 & bVar101;
                    if (bVar90 != 0) {
                      bVar101 = bVar90;
                    }
                    uVar92 = 0;
                    for (uVar93 = (uint)bVar101; (uVar93 & 1) == 0;
                        uVar93 = uVar93 >> 1 | 0x80000000) {
                      uVar92 = uVar92 + 1;
                    }
                    uVar91 = (ulong)uVar92;
                  } while( true );
                }
                fVar180 = local_520[uVar91];
                uVar178 = *(undefined4 *)(local_500 + uVar91 * 4);
                fVar176 = 1.0 - fVar180;
                fVar175 = fVar176 * fVar176 * -3.0;
                auVar210 = ZEXT464((uint)fVar175);
                auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176)),
                                           ZEXT416((uint)(fVar180 * fVar176)),ZEXT416(0xc0000000));
                auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar180 * fVar176)),
                                           ZEXT416((uint)(fVar180 * fVar180)),ZEXT416(0x40000000));
                fVar176 = auVar109._0_4_ * 3.0;
                fVar177 = auVar107._0_4_ * 3.0;
                fVar188 = fVar180 * fVar180 * 3.0;
                auVar211._0_4_ = fVar188 * fVar156;
                auVar211._4_4_ = fVar188 * fVar172;
                auVar211._8_4_ = fVar188 * fVar173;
                auVar211._12_4_ = fVar188 * fVar174;
                auVar215 = ZEXT1664(auVar211);
                auVar182._4_4_ = fVar177;
                auVar182._0_4_ = fVar177;
                auVar182._8_4_ = fVar177;
                auVar182._12_4_ = fVar177;
                auVar109 = vfmadd132ps_fma(auVar182,auVar211,auVar6);
                auVar192._4_4_ = fVar176;
                auVar192._0_4_ = fVar176;
                auVar192._8_4_ = fVar176;
                auVar192._12_4_ = fVar176;
                auVar109 = vfmadd132ps_fma(auVar192,auVar109,auVar32);
                auVar183._4_4_ = fVar175;
                auVar183._0_4_ = fVar175;
                auVar183._8_4_ = fVar175;
                auVar183._12_4_ = fVar175;
                auVar109 = vfmadd132ps_fma(auVar183,auVar109,auVar105);
                *(undefined4 *)(ray + sVar100 * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar91 * 4)
                ;
                *(int *)(ray + sVar100 * 4 + 0x300) = auVar109._0_4_;
                uVar12 = vextractps_avx(auVar109,1);
                *(undefined4 *)(ray + sVar100 * 4 + 0x340) = uVar12;
                uVar12 = vextractps_avx(auVar109,2);
                *(undefined4 *)(ray + sVar100 * 4 + 0x380) = uVar12;
                *(float *)(ray + sVar100 * 4 + 0x3c0) = fVar180;
                *(undefined4 *)(ray + sVar100 * 4 + 0x400) = uVar178;
                *(uint *)(ray + sVar100 * 4 + 0x440) = uVar92;
                *(uint *)(ray + sVar100 * 4 + 0x480) = uVar10;
                *(uint *)(ray + sVar100 * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + sVar100 * 4 + 0x500) = context->user->instPrimID[0];
LAB_01a24fd1:
                fVar180 = (float)local_820._0_4_;
              }
            }
          }
        }
      }
    }
    local_820._0_4_ = fVar180;
    if (8 < iVar11) {
      auVar117 = vpbroadcastd_avx512vl();
      auVar171 = ZEXT3264(auVar117);
      local_780 = (float)local_820._0_4_;
      fStack_77c = (float)local_820._0_4_;
      fStack_778 = (float)local_820._0_4_;
      fStack_774 = (float)local_820._0_4_;
      fStack_770 = (float)local_820._0_4_;
      fStack_76c = (float)local_820._0_4_;
      fStack_768 = (float)local_820._0_4_;
      fStack_764 = (float)local_820._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_440 = 1.0 / (float)local_7c0._0_4_;
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      lVar97 = 8;
LAB_01a2505f:
      if (lVar97 < local_7e8) {
        auVar117 = vpbroadcastd_avx512vl();
        auVar117 = vpor_avx2(auVar117,_DAT_01fb4ba0);
        uVar30 = vpcmpgtd_avx512vl(auVar171._0_32_,auVar117);
        auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar97 * 4 + lVar99);
        auVar115 = *(undefined1 (*) [32])(lVar99 + 0x21fb768 + lVar97 * 4);
        auVar116 = *(undefined1 (*) [32])(lVar99 + 0x21fbbec + lVar97 * 4);
        auVar125 = *(undefined1 (*) [32])(lVar99 + 0x21fc070 + lVar97 * 4);
        auVar216._0_4_ = auVar125._0_4_ * (float)local_6c0._0_4_;
        auVar216._4_4_ = auVar125._4_4_ * (float)local_6c0._4_4_;
        auVar216._8_4_ = auVar125._8_4_ * fStack_6b8;
        auVar216._12_4_ = auVar125._12_4_ * fStack_6b4;
        auVar216._16_4_ = auVar125._16_4_ * fStack_6b0;
        auVar216._20_4_ = auVar125._20_4_ * fStack_6ac;
        auVar216._28_36_ = auVar215._28_36_;
        auVar216._24_4_ = auVar125._24_4_ * fStack_6a8;
        auVar215._0_4_ = auVar125._0_4_ * (float)local_6e0._0_4_;
        auVar215._4_4_ = auVar125._4_4_ * (float)local_6e0._4_4_;
        auVar215._8_4_ = auVar125._8_4_ * fStack_6d8;
        auVar215._12_4_ = auVar125._12_4_ * fStack_6d4;
        auVar215._16_4_ = auVar125._16_4_ * fStack_6d0;
        auVar215._20_4_ = auVar125._20_4_ * fStack_6cc;
        auVar215._28_36_ = auVar210._28_36_;
        auVar215._24_4_ = auVar125._24_4_ * fStack_6c8;
        auVar119 = vmulps_avx512vl(local_400,auVar125);
        auVar118 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar116,local_680);
        auVar124 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar116,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_3e0);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,local_640);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar115,local_660);
        auVar123 = vfmadd231ps_avx512vl(auVar119,auVar115,local_3c0);
        auVar109 = vfmadd231ps_fma(auVar118,auVar117,local_600);
        auVar215 = ZEXT1664(auVar109);
        auVar107 = vfmadd231ps_fma(auVar124,auVar117,local_620);
        auVar210 = ZEXT1664(auVar107);
        auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar97 * 4 + lVar99);
        auVar118 = *(undefined1 (*) [32])(lVar99 + 0x21fdb88 + lVar97 * 4);
        auVar113 = vfmadd231ps_avx512vl(auVar123,auVar117,local_420);
        auVar124 = *(undefined1 (*) [32])(lVar99 + 0x21fe00c + lVar97 * 4);
        auVar123 = *(undefined1 (*) [32])(lVar99 + 0x21fe490 + lVar97 * 4);
        auVar221._0_4_ = auVar123._0_4_ * (float)local_6c0._0_4_;
        auVar221._4_4_ = auVar123._4_4_ * (float)local_6c0._4_4_;
        auVar221._8_4_ = auVar123._8_4_ * fStack_6b8;
        auVar221._12_4_ = auVar123._12_4_ * fStack_6b4;
        auVar221._16_4_ = auVar123._16_4_ * fStack_6b0;
        auVar221._20_4_ = auVar123._20_4_ * fStack_6ac;
        auVar221._28_36_ = auVar220._28_36_;
        auVar221._24_4_ = auVar123._24_4_ * fStack_6a8;
        auVar58._4_4_ = auVar123._4_4_ * (float)local_6e0._4_4_;
        auVar58._0_4_ = auVar123._0_4_ * (float)local_6e0._0_4_;
        auVar58._8_4_ = auVar123._8_4_ * fStack_6d8;
        auVar58._12_4_ = auVar123._12_4_ * fStack_6d4;
        auVar58._16_4_ = auVar123._16_4_ * fStack_6d0;
        auVar58._20_4_ = auVar123._20_4_ * fStack_6cc;
        auVar58._24_4_ = auVar123._24_4_ * fStack_6c8;
        auVar58._28_4_ = uStack_6c4;
        auVar120 = vmulps_avx512vl(local_400,auVar123);
        auVar121 = vfmadd231ps_avx512vl(auVar221._0_32_,auVar124,local_680);
        auVar114 = vfmadd231ps_avx512vl(auVar58,auVar124,local_6a0);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar124,local_3e0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,local_640);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar118,local_660);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar118,local_3c0);
        auVar106 = vfmadd231ps_fma(auVar121,auVar119,local_600);
        auVar220 = ZEXT1664(auVar106);
        auVar5 = vfmadd231ps_fma(auVar114,auVar119,local_620);
        auVar114 = vfmadd231ps_avx512vl(auVar120,auVar119,local_420);
        auVar111 = vmaxps_avx512vl(auVar113,auVar114);
        auVar120 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar109));
        auVar121 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar107));
        auVar112 = vmulps_avx512vl(ZEXT1632(auVar107),auVar120);
        auVar122 = vmulps_avx512vl(ZEXT1632(auVar109),auVar121);
        auVar112 = vsubps_avx512vl(auVar112,auVar122);
        auVar122 = vmulps_avx512vl(auVar121,auVar121);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar120,auVar120);
        auVar111 = vmulps_avx512vl(auVar111,auVar111);
        auVar111 = vmulps_avx512vl(auVar111,auVar122);
        auVar112 = vmulps_avx512vl(auVar112,auVar112);
        uVar28 = vcmpps_avx512vl(auVar112,auVar111,2);
        bVar101 = (byte)uVar30 & (byte)uVar28;
        if (bVar101 != 0) {
          in_ZMM25 = ZEXT3264(local_4c0);
          auVar123 = vmulps_avx512vl(local_4c0,auVar123);
          auVar124 = vfmadd213ps_avx512vl(auVar124,local_4a0,auVar123);
          auVar118 = vfmadd213ps_avx512vl(auVar118,local_480,auVar124);
          local_7a0 = auVar237._0_32_;
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_7a0,auVar118);
          auVar125 = vmulps_avx512vl(local_4c0,auVar125);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_4a0,auVar125);
          auVar115 = vfmadd213ps_avx512vl(auVar115,local_480,auVar116);
          auVar118 = vfmadd213ps_avx512vl(auVar117,local_7a0,auVar115);
          auVar117 = *(undefined1 (*) [32])(lVar99 + 0x21fc4f4 + lVar97 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar99 + 0x21fc978 + lVar97 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar99 + 0x21fcdfc + lVar97 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar99 + 0x21fd280 + lVar97 * 4);
          auVar124 = vmulps_avx512vl(_local_6c0,auVar125);
          auVar123 = vmulps_avx512vl(_local_6e0,auVar125);
          auVar125 = vmulps_avx512vl(local_4c0,auVar125);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar116,local_680);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,local_6a0);
          auVar116 = vfmadd231ps_avx512vl(auVar125,local_4a0,auVar116);
          auVar125 = vfmadd231ps_avx512vl(auVar124,auVar115,local_640);
          auVar124 = vfmadd231ps_avx512vl(auVar123,auVar115,local_660);
          auVar115 = vfmadd231ps_avx512vl(auVar116,local_480,auVar115);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar117,local_600);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar117,local_620);
          auVar123 = vfmadd231ps_avx512vl(auVar115,local_7a0,auVar117);
          auVar117 = *(undefined1 (*) [32])(lVar99 + 0x21fe914 + lVar97 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar99 + 0x21ff21c + lVar97 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar99 + 0x21ff6a0 + lVar97 * 4);
          auVar111 = vmulps_avx512vl(_local_6c0,auVar116);
          auVar112 = vmulps_avx512vl(_local_6e0,auVar116);
          auVar116 = vmulps_avx512vl(local_4c0,auVar116);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_680);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_6a0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,local_4a0,auVar115);
          auVar115 = *(undefined1 (*) [32])(lVar99 + 0x21fed98 + lVar97 * 4);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_640);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_660);
          auVar115 = vfmadd231ps_avx512vl(auVar116,local_480,auVar115);
          auVar116 = vfmadd231ps_avx512vl(auVar111,auVar117,local_600);
          auVar111 = vfmadd231ps_avx512vl(auVar112,auVar117,local_620);
          auVar115 = vfmadd231ps_avx512vl(auVar115,local_7a0,auVar117);
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar125,auVar112);
          vandps_avx512vl(auVar124,auVar112);
          auVar117 = vmaxps_avx(auVar112,auVar112);
          vandps_avx512vl(auVar123,auVar112);
          auVar117 = vmaxps_avx(auVar117,auVar112);
          auVar88._4_4_ = fStack_77c;
          auVar88._0_4_ = local_780;
          auVar88._8_4_ = fStack_778;
          auVar88._12_4_ = fStack_774;
          auVar88._16_4_ = fStack_770;
          auVar88._20_4_ = fStack_76c;
          auVar88._24_4_ = fStack_768;
          auVar88._28_4_ = fStack_764;
          uVar91 = vcmpps_avx512vl(auVar117,auVar88,1);
          bVar14 = (bool)((byte)uVar91 & 1);
          auVar137._0_4_ = (float)((uint)bVar14 * auVar120._0_4_ | (uint)!bVar14 * auVar125._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar137._4_4_ = (float)((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar125._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar137._8_4_ = (float)((uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar125._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar137._12_4_ =
               (float)((uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar125._12_4_);
          bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
          auVar137._16_4_ =
               (float)((uint)bVar14 * auVar120._16_4_ | (uint)!bVar14 * auVar125._16_4_);
          bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
          auVar137._20_4_ =
               (float)((uint)bVar14 * auVar120._20_4_ | (uint)!bVar14 * auVar125._20_4_);
          bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
          auVar137._24_4_ =
               (float)((uint)bVar14 * auVar120._24_4_ | (uint)!bVar14 * auVar125._24_4_);
          bVar14 = SUB81(uVar91 >> 7,0);
          auVar137._28_4_ = (uint)bVar14 * auVar120._28_4_ | (uint)!bVar14 * auVar125._28_4_;
          bVar14 = (bool)((byte)uVar91 & 1);
          auVar138._0_4_ = (float)((uint)bVar14 * auVar121._0_4_ | (uint)!bVar14 * auVar124._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar138._4_4_ = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar124._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar138._8_4_ = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar124._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar138._12_4_ =
               (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar124._12_4_);
          bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
          auVar138._16_4_ =
               (float)((uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * auVar124._16_4_);
          bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
          auVar138._20_4_ =
               (float)((uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * auVar124._20_4_);
          bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
          auVar138._24_4_ =
               (float)((uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * auVar124._24_4_);
          bVar14 = SUB81(uVar91 >> 7,0);
          auVar138._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar124._28_4_;
          vandps_avx512vl(auVar116,auVar112);
          vandps_avx512vl(auVar111,auVar112);
          auVar117 = vmaxps_avx(auVar138,auVar138);
          vandps_avx512vl(auVar115,auVar112);
          auVar117 = vmaxps_avx(auVar117,auVar138);
          uVar91 = vcmpps_avx512vl(auVar117,auVar88,1);
          bVar14 = (bool)((byte)uVar91 & 1);
          auVar139._0_4_ = (uint)bVar14 * auVar120._0_4_ | (uint)!bVar14 * auVar116._0_4_;
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar116._4_4_;
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar116._8_4_;
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar116._12_4_;
          bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
          auVar139._16_4_ = (uint)bVar14 * auVar120._16_4_ | (uint)!bVar14 * auVar116._16_4_;
          bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
          auVar139._20_4_ = (uint)bVar14 * auVar120._20_4_ | (uint)!bVar14 * auVar116._20_4_;
          bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
          auVar139._24_4_ = (uint)bVar14 * auVar120._24_4_ | (uint)!bVar14 * auVar116._24_4_;
          bVar14 = SUB81(uVar91 >> 7,0);
          auVar139._28_4_ = (uint)bVar14 * auVar120._28_4_ | (uint)!bVar14 * auVar116._28_4_;
          bVar14 = (bool)((byte)uVar91 & 1);
          auVar140._0_4_ = (float)((uint)bVar14 * auVar121._0_4_ | (uint)!bVar14 * auVar111._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar111._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar111._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar111._12_4_);
          bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
          auVar140._16_4_ =
               (float)((uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * auVar111._16_4_);
          bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
          auVar140._20_4_ =
               (float)((uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * auVar111._20_4_);
          bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
          auVar140._24_4_ =
               (float)((uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * auVar111._24_4_);
          bVar14 = SUB81(uVar91 >> 7,0);
          auVar140._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar111._28_4_;
          auVar223._8_4_ = 0x80000000;
          auVar223._0_8_ = 0x8000000080000000;
          auVar223._12_4_ = 0x80000000;
          auVar223._16_4_ = 0x80000000;
          auVar223._20_4_ = 0x80000000;
          auVar223._24_4_ = 0x80000000;
          auVar223._28_4_ = 0x80000000;
          auVar117 = vxorps_avx512vl(auVar139,auVar223);
          auVar110 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar115 = vfmadd213ps_avx512vl(auVar137,auVar137,ZEXT1632(auVar110));
          auVar7 = vfmadd231ps_fma(auVar115,auVar138,auVar138);
          auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar234._8_4_ = 0xbf000000;
          auVar234._0_8_ = 0xbf000000bf000000;
          auVar234._12_4_ = 0xbf000000;
          auVar234._16_4_ = 0xbf000000;
          auVar234._20_4_ = 0xbf000000;
          auVar234._24_4_ = 0xbf000000;
          auVar234._28_4_ = 0xbf000000;
          fVar180 = auVar115._0_4_;
          fVar175 = auVar115._4_4_;
          fVar176 = auVar115._8_4_;
          fVar177 = auVar115._12_4_;
          fVar188 = auVar115._16_4_;
          fVar189 = auVar115._20_4_;
          fVar201 = auVar115._24_4_;
          auVar59._4_4_ = fVar175 * fVar175 * fVar175 * auVar7._4_4_ * -0.5;
          auVar59._0_4_ = fVar180 * fVar180 * fVar180 * auVar7._0_4_ * -0.5;
          auVar59._8_4_ = fVar176 * fVar176 * fVar176 * auVar7._8_4_ * -0.5;
          auVar59._12_4_ = fVar177 * fVar177 * fVar177 * auVar7._12_4_ * -0.5;
          auVar59._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
          auVar59._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
          auVar59._24_4_ = fVar201 * fVar201 * fVar201 * -0.0;
          auVar59._28_4_ = auVar138._28_4_;
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar115 = vfmadd231ps_avx512vl(auVar59,auVar116,auVar115);
          auVar60._4_4_ = auVar138._4_4_ * auVar115._4_4_;
          auVar60._0_4_ = auVar138._0_4_ * auVar115._0_4_;
          auVar60._8_4_ = auVar138._8_4_ * auVar115._8_4_;
          auVar60._12_4_ = auVar138._12_4_ * auVar115._12_4_;
          auVar60._16_4_ = auVar138._16_4_ * auVar115._16_4_;
          auVar60._20_4_ = auVar138._20_4_ * auVar115._20_4_;
          auVar60._24_4_ = auVar138._24_4_ * auVar115._24_4_;
          auVar60._28_4_ = 0;
          auVar61._4_4_ = auVar115._4_4_ * -auVar137._4_4_;
          auVar61._0_4_ = auVar115._0_4_ * -auVar137._0_4_;
          auVar61._8_4_ = auVar115._8_4_ * -auVar137._8_4_;
          auVar61._12_4_ = auVar115._12_4_ * -auVar137._12_4_;
          auVar61._16_4_ = auVar115._16_4_ * -auVar137._16_4_;
          auVar61._20_4_ = auVar115._20_4_ * -auVar137._20_4_;
          auVar61._24_4_ = auVar115._24_4_ * -auVar137._24_4_;
          auVar61._28_4_ = auVar138._28_4_;
          auVar125 = vmulps_avx512vl(auVar115,ZEXT1632(auVar110));
          auVar123 = ZEXT1632(auVar110);
          auVar115 = vfmadd213ps_avx512vl(auVar139,auVar139,auVar123);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar140,auVar140);
          auVar124 = vrsqrt14ps_avx512vl(auVar115);
          auVar115 = vmulps_avx512vl(auVar115,auVar234);
          fVar180 = auVar124._0_4_;
          fVar175 = auVar124._4_4_;
          fVar176 = auVar124._8_4_;
          fVar177 = auVar124._12_4_;
          fVar188 = auVar124._16_4_;
          fVar189 = auVar124._20_4_;
          fVar201 = auVar124._24_4_;
          auVar62._4_4_ = fVar175 * fVar175 * fVar175 * auVar115._4_4_;
          auVar62._0_4_ = fVar180 * fVar180 * fVar180 * auVar115._0_4_;
          auVar62._8_4_ = fVar176 * fVar176 * fVar176 * auVar115._8_4_;
          auVar62._12_4_ = fVar177 * fVar177 * fVar177 * auVar115._12_4_;
          auVar62._16_4_ = fVar188 * fVar188 * fVar188 * auVar115._16_4_;
          auVar62._20_4_ = fVar189 * fVar189 * fVar189 * auVar115._20_4_;
          auVar62._24_4_ = fVar201 * fVar201 * fVar201 * auVar115._24_4_;
          auVar62._28_4_ = auVar115._28_4_;
          auVar115 = vfmadd231ps_avx512vl(auVar62,auVar116,auVar124);
          auVar63._4_4_ = auVar140._4_4_ * auVar115._4_4_;
          auVar63._0_4_ = auVar140._0_4_ * auVar115._0_4_;
          auVar63._8_4_ = auVar140._8_4_ * auVar115._8_4_;
          auVar63._12_4_ = auVar140._12_4_ * auVar115._12_4_;
          auVar63._16_4_ = auVar140._16_4_ * auVar115._16_4_;
          auVar63._20_4_ = auVar140._20_4_ * auVar115._20_4_;
          auVar63._24_4_ = auVar140._24_4_ * auVar115._24_4_;
          auVar63._28_4_ = auVar124._28_4_;
          auVar64._4_4_ = auVar115._4_4_ * auVar117._4_4_;
          auVar64._0_4_ = auVar115._0_4_ * auVar117._0_4_;
          auVar64._8_4_ = auVar115._8_4_ * auVar117._8_4_;
          auVar64._12_4_ = auVar115._12_4_ * auVar117._12_4_;
          auVar64._16_4_ = auVar115._16_4_ * auVar117._16_4_;
          auVar64._20_4_ = auVar115._20_4_ * auVar117._20_4_;
          auVar64._24_4_ = auVar115._24_4_ * auVar117._24_4_;
          auVar64._28_4_ = auVar117._28_4_;
          auVar117 = vmulps_avx512vl(auVar115,auVar123);
          auVar7 = vfmadd213ps_fma(auVar60,auVar113,ZEXT1632(auVar109));
          auVar8 = vfmadd213ps_fma(auVar61,auVar113,ZEXT1632(auVar107));
          auVar116 = vfmadd213ps_avx512vl(auVar125,auVar113,auVar118);
          auVar124 = vfmadd213ps_avx512vl(auVar63,auVar114,ZEXT1632(auVar106));
          auVar157 = vfnmadd213ps_fma(auVar60,auVar113,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar64,auVar114,ZEXT1632(auVar5));
          auVar181 = vfnmadd213ps_fma(auVar61,auVar113,ZEXT1632(auVar107));
          auVar107 = vfmadd213ps_fma(auVar117,auVar114,auVar119);
          auVar108 = vfnmadd231ps_fma(auVar118,auVar113,auVar125);
          auVar190 = vfnmadd213ps_fma(auVar63,auVar114,ZEXT1632(auVar106));
          auVar191 = vfnmadd213ps_fma(auVar64,auVar114,ZEXT1632(auVar5));
          auVar222 = vfnmadd231ps_fma(auVar119,auVar114,auVar117);
          auVar119 = vsubps_avx512vl(auVar124,ZEXT1632(auVar157));
          auVar117 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar181));
          auVar115 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar108));
          auVar65._4_4_ = auVar117._4_4_ * auVar108._4_4_;
          auVar65._0_4_ = auVar117._0_4_ * auVar108._0_4_;
          auVar65._8_4_ = auVar117._8_4_ * auVar108._8_4_;
          auVar65._12_4_ = auVar117._12_4_ * auVar108._12_4_;
          auVar65._16_4_ = auVar117._16_4_ * 0.0;
          auVar65._20_4_ = auVar117._20_4_ * 0.0;
          auVar65._24_4_ = auVar117._24_4_ * 0.0;
          auVar65._28_4_ = auVar125._28_4_;
          auVar106 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar181),auVar115);
          auVar66._4_4_ = auVar115._4_4_ * auVar157._4_4_;
          auVar66._0_4_ = auVar115._0_4_ * auVar157._0_4_;
          auVar66._8_4_ = auVar115._8_4_ * auVar157._8_4_;
          auVar66._12_4_ = auVar115._12_4_ * auVar157._12_4_;
          auVar66._16_4_ = auVar115._16_4_ * 0.0;
          auVar66._20_4_ = auVar115._20_4_ * 0.0;
          auVar66._24_4_ = auVar115._24_4_ * 0.0;
          auVar66._28_4_ = auVar115._28_4_;
          auVar5 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar108),auVar119);
          auVar67._4_4_ = auVar181._4_4_ * auVar119._4_4_;
          auVar67._0_4_ = auVar181._0_4_ * auVar119._0_4_;
          auVar67._8_4_ = auVar181._8_4_ * auVar119._8_4_;
          auVar67._12_4_ = auVar181._12_4_ * auVar119._12_4_;
          auVar67._16_4_ = auVar119._16_4_ * 0.0;
          auVar67._20_4_ = auVar119._20_4_ * 0.0;
          auVar67._24_4_ = auVar119._24_4_ * 0.0;
          auVar67._28_4_ = auVar119._28_4_;
          auVar9 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar157),auVar117);
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar123,ZEXT1632(auVar5));
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar123,ZEXT1632(auVar106));
          auVar112 = ZEXT1632(auVar110);
          uVar91 = vcmpps_avx512vl(auVar117,auVar112,2);
          bVar90 = (byte)uVar91;
          fVar204 = (float)((uint)(bVar90 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar90 & 1) * auVar190._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          fVar104 = (float)((uint)bVar14 * auVar7._4_4_ | (uint)!bVar14 * auVar190._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          fVar151 = (float)((uint)bVar14 * auVar7._8_4_ | (uint)!bVar14 * auVar190._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          fVar153 = (float)((uint)bVar14 * auVar7._12_4_ | (uint)!bVar14 * auVar190._12_4_);
          auVar123 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar104,fVar204))));
          fVar103 = (float)((uint)(bVar90 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar90 & 1) * auVar191._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          fVar150 = (float)((uint)bVar14 * auVar8._4_4_ | (uint)!bVar14 * auVar191._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          fVar152 = (float)((uint)bVar14 * auVar8._8_4_ | (uint)!bVar14 * auVar191._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          fVar154 = (float)((uint)bVar14 * auVar8._12_4_ | (uint)!bVar14 * auVar191._12_4_);
          auVar120 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar152,CONCAT44(fVar150,fVar103))));
          auVar141._0_4_ =
               (float)((uint)(bVar90 & 1) * auVar116._0_4_ |
                      (uint)!(bool)(bVar90 & 1) * auVar222._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar222._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar222._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar141._12_4_ =
               (float)((uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar222._12_4_);
          fVar180 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar116._16_4_);
          auVar141._16_4_ = fVar180;
          fVar176 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar116._20_4_);
          auVar141._20_4_ = fVar176;
          fVar175 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar116._24_4_);
          auVar141._24_4_ = fVar175;
          iVar1 = (uint)(byte)(uVar91 >> 7) * auVar116._28_4_;
          auVar141._28_4_ = iVar1;
          auVar117 = vblendmps_avx512vl(ZEXT1632(auVar157),auVar124);
          auVar142._0_4_ =
               (uint)(bVar90 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar106._0_4_;
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar106._4_4_;
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar106._8_4_;
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar106._12_4_;
          auVar142._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * auVar117._16_4_;
          auVar142._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * auVar117._20_4_;
          auVar142._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * auVar117._24_4_;
          auVar142._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar117._28_4_;
          auVar117 = vblendmps_avx512vl(ZEXT1632(auVar181),ZEXT1632(auVar109));
          auVar143._0_4_ =
               (float)((uint)(bVar90 & 1) * auVar117._0_4_ |
                      (uint)!(bool)(bVar90 & 1) * auVar7._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar7._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar7._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar143._12_4_ = (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar7._12_4_);
          fVar189 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar117._16_4_);
          auVar143._16_4_ = fVar189;
          fVar188 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar117._20_4_);
          auVar143._20_4_ = fVar188;
          fVar177 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar117._24_4_);
          auVar143._24_4_ = fVar177;
          auVar143._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar117._28_4_;
          auVar117 = vblendmps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar107));
          auVar144._0_4_ =
               (float)((uint)(bVar90 & 1) * auVar117._0_4_ |
                      (uint)!(bool)(bVar90 & 1) * auVar8._0_4_);
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar144._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar8._4_4_);
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar144._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar8._8_4_);
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar144._12_4_ = (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar8._12_4_);
          fVar203 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar117._16_4_);
          auVar144._16_4_ = fVar203;
          fVar202 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar117._20_4_);
          auVar144._20_4_ = fVar202;
          fVar201 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar117._24_4_);
          auVar144._24_4_ = fVar201;
          iVar2 = (uint)(byte)(uVar91 >> 7) * auVar117._28_4_;
          auVar144._28_4_ = iVar2;
          auVar145._0_4_ =
               (uint)(bVar90 & 1) * (int)auVar157._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar124._0_4_
          ;
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar14 * (int)auVar157._4_4_ | (uint)!bVar14 * auVar124._4_4_;
          bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar14 * (int)auVar157._8_4_ | (uint)!bVar14 * auVar124._8_4_;
          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar14 * (int)auVar157._12_4_ | (uint)!bVar14 * auVar124._12_4_;
          auVar145._16_4_ = (uint)!(bool)((byte)(uVar91 >> 4) & 1) * auVar124._16_4_;
          auVar145._20_4_ = (uint)!(bool)((byte)(uVar91 >> 5) & 1) * auVar124._20_4_;
          auVar145._24_4_ = (uint)!(bool)((byte)(uVar91 >> 6) & 1) * auVar124._24_4_;
          auVar145._28_4_ = (uint)!SUB81(uVar91 >> 7,0) * auVar124._28_4_;
          bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar91 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar91 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar124 = vsubps_avx512vl(auVar145,auVar123);
          auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar181._12_4_ |
                                                   (uint)!bVar18 * auVar109._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar181._8_4_ |
                                                            (uint)!bVar16 * auVar109._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar181._4_4_ |
                                                                     (uint)!bVar14 * auVar109._4_4_,
                                                                     (uint)(bVar90 & 1) *
                                                                     (int)auVar181._0_4_ |
                                                                     (uint)!(bool)(bVar90 & 1) *
                                                                     auVar109._0_4_)))),auVar120);
          auVar215 = ZEXT3264(auVar115);
          auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar108._12_4_ |
                                                   (uint)!bVar19 * auVar107._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar108._8_4_ |
                                                            (uint)!bVar17 * auVar107._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar108._4_4_ |
                                                                     (uint)!bVar15 * auVar107._4_4_,
                                                                     (uint)(bVar90 & 1) *
                                                                     (int)auVar108._0_4_ |
                                                                     (uint)!(bool)(bVar90 & 1) *
                                                                     auVar107._0_4_)))),auVar141);
          auVar125 = vsubps_avx(auVar123,auVar142);
          auVar220 = ZEXT3264(auVar125);
          auVar119 = vsubps_avx(auVar120,auVar143);
          auVar118 = vsubps_avx(auVar141,auVar144);
          auVar68._4_4_ = auVar116._4_4_ * fVar104;
          auVar68._0_4_ = auVar116._0_4_ * fVar204;
          auVar68._8_4_ = auVar116._8_4_ * fVar151;
          auVar68._12_4_ = auVar116._12_4_ * fVar153;
          auVar68._16_4_ = auVar116._16_4_ * 0.0;
          auVar68._20_4_ = auVar116._20_4_ * 0.0;
          auVar68._24_4_ = auVar116._24_4_ * 0.0;
          auVar68._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar68,auVar141,auVar124);
          auVar199._0_4_ = fVar103 * auVar124._0_4_;
          auVar199._4_4_ = fVar150 * auVar124._4_4_;
          auVar199._8_4_ = fVar152 * auVar124._8_4_;
          auVar199._12_4_ = fVar154 * auVar124._12_4_;
          auVar199._16_4_ = auVar124._16_4_ * 0.0;
          auVar199._20_4_ = auVar124._20_4_ * 0.0;
          auVar199._24_4_ = auVar124._24_4_ * 0.0;
          auVar199._28_4_ = 0;
          auVar107 = vfmsub231ps_fma(auVar199,auVar123,auVar115);
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar112,ZEXT1632(auVar109));
          auVar208._0_4_ = auVar115._0_4_ * auVar141._0_4_;
          auVar208._4_4_ = auVar115._4_4_ * auVar141._4_4_;
          auVar208._8_4_ = auVar115._8_4_ * auVar141._8_4_;
          auVar208._12_4_ = auVar115._12_4_ * auVar141._12_4_;
          auVar208._16_4_ = auVar115._16_4_ * fVar180;
          auVar208._20_4_ = auVar115._20_4_ * fVar176;
          auVar208._24_4_ = auVar115._24_4_ * fVar175;
          auVar208._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar208,auVar120,auVar116);
          auVar121 = vfmadd231ps_avx512vl(auVar117,auVar112,ZEXT1632(auVar109));
          auVar117 = vmulps_avx512vl(auVar118,auVar142);
          auVar117 = vfmsub231ps_avx512vl(auVar117,auVar125,auVar144);
          auVar69._4_4_ = auVar119._4_4_ * auVar144._4_4_;
          auVar69._0_4_ = auVar119._0_4_ * auVar144._0_4_;
          auVar69._8_4_ = auVar119._8_4_ * auVar144._8_4_;
          auVar69._12_4_ = auVar119._12_4_ * auVar144._12_4_;
          auVar69._16_4_ = auVar119._16_4_ * fVar203;
          auVar69._20_4_ = auVar119._20_4_ * fVar202;
          auVar69._24_4_ = auVar119._24_4_ * fVar201;
          auVar69._28_4_ = iVar2;
          auVar109 = vfmsub231ps_fma(auVar69,auVar143,auVar118);
          auVar209._0_4_ = auVar143._0_4_ * auVar125._0_4_;
          auVar209._4_4_ = auVar143._4_4_ * auVar125._4_4_;
          auVar209._8_4_ = auVar143._8_4_ * auVar125._8_4_;
          auVar209._12_4_ = auVar143._12_4_ * auVar125._12_4_;
          auVar209._16_4_ = fVar189 * auVar125._16_4_;
          auVar209._20_4_ = fVar188 * auVar125._20_4_;
          auVar209._24_4_ = fVar177 * auVar125._24_4_;
          auVar209._28_4_ = 0;
          auVar107 = vfmsub231ps_fma(auVar209,auVar119,auVar142);
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar112,auVar117);
          auVar111 = vfmadd231ps_avx512vl(auVar117,auVar112,ZEXT1632(auVar109));
          auVar210 = ZEXT3264(auVar111);
          auVar117 = vmaxps_avx(auVar121,auVar111);
          uVar28 = vcmpps_avx512vl(auVar117,auVar112,2);
          bVar101 = bVar101 & (byte)uVar28;
          if (bVar101 != 0) {
            auVar70._4_4_ = auVar118._4_4_ * auVar115._4_4_;
            auVar70._0_4_ = auVar118._0_4_ * auVar115._0_4_;
            auVar70._8_4_ = auVar118._8_4_ * auVar115._8_4_;
            auVar70._12_4_ = auVar118._12_4_ * auVar115._12_4_;
            auVar70._16_4_ = auVar118._16_4_ * auVar115._16_4_;
            auVar70._20_4_ = auVar118._20_4_ * auVar115._20_4_;
            auVar70._24_4_ = auVar118._24_4_ * auVar115._24_4_;
            auVar70._28_4_ = auVar117._28_4_;
            auVar5 = vfmsub231ps_fma(auVar70,auVar119,auVar116);
            auVar71._4_4_ = auVar116._4_4_ * auVar125._4_4_;
            auVar71._0_4_ = auVar116._0_4_ * auVar125._0_4_;
            auVar71._8_4_ = auVar116._8_4_ * auVar125._8_4_;
            auVar71._12_4_ = auVar116._12_4_ * auVar125._12_4_;
            auVar71._16_4_ = auVar116._16_4_ * auVar125._16_4_;
            auVar71._20_4_ = auVar116._20_4_ * auVar125._20_4_;
            auVar71._24_4_ = auVar116._24_4_ * auVar125._24_4_;
            auVar71._28_4_ = auVar116._28_4_;
            auVar106 = vfmsub231ps_fma(auVar71,auVar124,auVar118);
            auVar72._4_4_ = auVar119._4_4_ * auVar124._4_4_;
            auVar72._0_4_ = auVar119._0_4_ * auVar124._0_4_;
            auVar72._8_4_ = auVar119._8_4_ * auVar124._8_4_;
            auVar72._12_4_ = auVar119._12_4_ * auVar124._12_4_;
            auVar72._16_4_ = auVar119._16_4_ * auVar124._16_4_;
            auVar72._20_4_ = auVar119._20_4_ * auVar124._20_4_;
            auVar72._24_4_ = auVar119._24_4_ * auVar124._24_4_;
            auVar72._28_4_ = auVar119._28_4_;
            auVar7 = vfmsub231ps_fma(auVar72,auVar125,auVar115);
            auVar109 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar106),ZEXT1632(auVar7));
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar5),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar117 = vrcp14ps_avx512vl(ZEXT1632(auVar107));
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            auVar38._16_4_ = 0x3f800000;
            auVar38._20_4_ = 0x3f800000;
            auVar38._24_4_ = 0x3f800000;
            auVar38._28_4_ = 0x3f800000;
            auVar115 = vfnmadd213ps_avx512vl(auVar117,ZEXT1632(auVar107),auVar38);
            auVar109 = vfmadd132ps_fma(auVar115,auVar117,auVar117);
            auVar215 = ZEXT1664(auVar109);
            auVar73._4_4_ = auVar7._4_4_ * auVar141._4_4_;
            auVar73._0_4_ = auVar7._0_4_ * auVar141._0_4_;
            auVar73._8_4_ = auVar7._8_4_ * auVar141._8_4_;
            auVar73._12_4_ = auVar7._12_4_ * auVar141._12_4_;
            auVar73._16_4_ = fVar180 * 0.0;
            auVar73._20_4_ = fVar176 * 0.0;
            auVar73._24_4_ = fVar175 * 0.0;
            auVar73._28_4_ = iVar1;
            auVar106 = vfmadd231ps_fma(auVar73,auVar120,ZEXT1632(auVar106));
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar123,ZEXT1632(auVar5));
            fVar180 = auVar109._0_4_;
            fVar175 = auVar109._4_4_;
            fVar176 = auVar109._8_4_;
            fVar177 = auVar109._12_4_;
            local_5a0._28_4_ = auVar117._28_4_;
            local_5a0._0_28_ =
                 ZEXT1628(CONCAT412(auVar106._12_4_ * fVar177,
                                    CONCAT48(auVar106._8_4_ * fVar176,
                                             CONCAT44(auVar106._4_4_ * fVar175,
                                                      auVar106._0_4_ * fVar180))));
            auVar220 = ZEXT3264(local_5a0);
            auVar89._4_4_ = uStack_75c;
            auVar89._0_4_ = local_760;
            auVar89._8_4_ = uStack_758;
            auVar89._12_4_ = uStack_754;
            auVar89._16_4_ = uStack_750;
            auVar89._20_4_ = uStack_74c;
            auVar89._24_4_ = uStack_748;
            auVar89._28_4_ = uStack_744;
            uVar28 = vcmpps_avx512vl(local_5a0,auVar89,0xd);
            uVar178 = *(undefined4 *)(ray + sVar100 * 4 + 0x200);
            auVar39._4_4_ = uVar178;
            auVar39._0_4_ = uVar178;
            auVar39._8_4_ = uVar178;
            auVar39._12_4_ = uVar178;
            auVar39._16_4_ = uVar178;
            auVar39._20_4_ = uVar178;
            auVar39._24_4_ = uVar178;
            auVar39._28_4_ = uVar178;
            uVar30 = vcmpps_avx512vl(local_5a0,auVar39,2);
            bVar101 = (byte)uVar28 & (byte)uVar30 & bVar101;
            if (bVar101 != 0) {
              uVar102 = vcmpps_avx512vl(ZEXT1632(auVar107),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar102 = bVar101 & uVar102;
              if ((char)uVar102 != '\0') {
                fVar188 = auVar121._0_4_ * fVar180;
                fVar189 = auVar121._4_4_ * fVar175;
                auVar74._4_4_ = fVar189;
                auVar74._0_4_ = fVar188;
                fVar201 = auVar121._8_4_ * fVar176;
                auVar74._8_4_ = fVar201;
                fVar202 = auVar121._12_4_ * fVar177;
                auVar74._12_4_ = fVar202;
                fVar203 = auVar121._16_4_ * 0.0;
                auVar74._16_4_ = fVar203;
                fVar204 = auVar121._20_4_ * 0.0;
                auVar74._20_4_ = fVar204;
                fVar103 = auVar121._24_4_ * 0.0;
                auVar74._24_4_ = fVar103;
                auVar74._28_4_ = auVar121._28_4_;
                auVar187._8_4_ = 0x3f800000;
                auVar187._0_8_ = 0x3f8000003f800000;
                auVar187._12_4_ = 0x3f800000;
                auVar187._16_4_ = 0x3f800000;
                auVar187._20_4_ = 0x3f800000;
                auVar187._24_4_ = 0x3f800000;
                auVar187._28_4_ = 0x3f800000;
                auVar117 = vsubps_avx(auVar187,auVar74);
                local_5e0._0_4_ =
                     (float)((uint)(bVar90 & 1) * (int)fVar188 |
                            (uint)!(bool)(bVar90 & 1) * auVar117._0_4_);
                bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar14 * (int)fVar189 | (uint)!bVar14 * auVar117._4_4_);
                bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar14 * (int)fVar201 | (uint)!bVar14 * auVar117._8_4_);
                bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar14 * (int)fVar202 | (uint)!bVar14 * auVar117._12_4_);
                bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar14 * (int)fVar203 | (uint)!bVar14 * auVar117._16_4_);
                bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar14 * (int)fVar204 | (uint)!bVar14 * auVar117._20_4_);
                bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar14 * (int)fVar103 | (uint)!bVar14 * auVar117._24_4_);
                bVar14 = SUB81(uVar91 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar117._28_4_);
                auVar117 = vsubps_avx(auVar114,auVar113);
                auVar109 = vfmadd213ps_fma(auVar117,local_5e0,auVar113);
                uVar178 = *(undefined4 *)((long)local_7f8->ray_space + sVar100 * 4 + -0x40);
                auVar40._4_4_ = uVar178;
                auVar40._0_4_ = uVar178;
                auVar40._8_4_ = uVar178;
                auVar40._12_4_ = uVar178;
                auVar40._16_4_ = uVar178;
                auVar40._20_4_ = uVar178;
                auVar40._24_4_ = uVar178;
                auVar40._28_4_ = uVar178;
                auVar117 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar109._12_4_ + auVar109._12_4_,
                                                              CONCAT48(auVar109._8_4_ +
                                                                       auVar109._8_4_,
                                                                       CONCAT44(auVar109._4_4_ +
                                                                                auVar109._4_4_,
                                                                                auVar109._0_4_ +
                                                                                auVar109._0_4_)))),
                                           auVar40);
                uVar29 = vcmpps_avx512vl(local_5a0,auVar117,6);
                uVar102 = uVar102 & uVar29;
                bVar101 = (byte)uVar102;
                if (bVar101 != 0) {
                  auVar179._0_4_ = auVar111._0_4_ * fVar180;
                  auVar179._4_4_ = auVar111._4_4_ * fVar175;
                  auVar179._8_4_ = auVar111._8_4_ * fVar176;
                  auVar179._12_4_ = auVar111._12_4_ * fVar177;
                  auVar179._16_4_ = auVar111._16_4_ * 0.0;
                  auVar179._20_4_ = auVar111._20_4_ * 0.0;
                  auVar179._24_4_ = auVar111._24_4_ * 0.0;
                  auVar179._28_4_ = 0;
                  auVar200._8_4_ = 0x3f800000;
                  auVar200._0_8_ = 0x3f8000003f800000;
                  auVar200._12_4_ = 0x3f800000;
                  auVar200._16_4_ = 0x3f800000;
                  auVar200._20_4_ = 0x3f800000;
                  auVar200._24_4_ = 0x3f800000;
                  auVar200._28_4_ = 0x3f800000;
                  auVar117 = vsubps_avx(auVar200,auVar179);
                  auVar146._0_4_ =
                       (uint)(bVar90 & 1) * (int)auVar179._0_4_ |
                       (uint)!(bool)(bVar90 & 1) * auVar117._0_4_;
                  bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
                  auVar146._4_4_ =
                       (uint)bVar14 * (int)auVar179._4_4_ | (uint)!bVar14 * auVar117._4_4_;
                  bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                  auVar146._8_4_ =
                       (uint)bVar14 * (int)auVar179._8_4_ | (uint)!bVar14 * auVar117._8_4_;
                  bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                  auVar146._12_4_ =
                       (uint)bVar14 * (int)auVar179._12_4_ | (uint)!bVar14 * auVar117._12_4_;
                  bVar14 = (bool)((byte)(uVar91 >> 4) & 1);
                  auVar146._16_4_ =
                       (uint)bVar14 * (int)auVar179._16_4_ | (uint)!bVar14 * auVar117._16_4_;
                  bVar14 = (bool)((byte)(uVar91 >> 5) & 1);
                  auVar146._20_4_ =
                       (uint)bVar14 * (int)auVar179._20_4_ | (uint)!bVar14 * auVar117._20_4_;
                  bVar14 = (bool)((byte)(uVar91 >> 6) & 1);
                  auVar146._24_4_ =
                       (uint)bVar14 * (int)auVar179._24_4_ | (uint)!bVar14 * auVar117._24_4_;
                  auVar146._28_4_ = (uint)!SUB81(uVar91 >> 7,0) * auVar117._28_4_;
                  auVar41._8_4_ = 0x40000000;
                  auVar41._0_8_ = 0x4000000040000000;
                  auVar41._12_4_ = 0x40000000;
                  auVar41._16_4_ = 0x40000000;
                  auVar41._20_4_ = 0x40000000;
                  auVar41._24_4_ = 0x40000000;
                  auVar41._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar146,auVar200,auVar41);
                  local_580 = (undefined4)lVar97;
                  local_570 = local_860;
                  uStack_568 = uStack_858;
                  local_560 = local_880;
                  uStack_558 = uStack_878;
                  local_550 = local_890;
                  uStack_548 = uStack_888;
                  local_540 = local_870;
                  uStack_538 = uStack_868;
                  pGVar96 = (context->scene->geometries).items[uVar10].ptr;
                  if ((pGVar96->mask & *(uint *)(ray + sVar100 * 4 + 0x240)) != 0) {
                    auVar109 = vcvtsi2ss_avx512f(auVar110,local_580);
                    fVar180 = auVar109._0_4_;
                    local_520[0] = (fVar180 + local_5e0._0_4_ + 0.0) * local_440;
                    local_520[1] = (fVar180 + local_5e0._4_4_ + 1.0) * fStack_43c;
                    local_520[2] = (fVar180 + local_5e0._8_4_ + 2.0) * fStack_438;
                    local_520[3] = (fVar180 + local_5e0._12_4_ + 3.0) * fStack_434;
                    fStack_510 = (fVar180 + local_5e0._16_4_ + 4.0) * fStack_430;
                    fStack_50c = (fVar180 + local_5e0._20_4_ + 5.0) * fStack_42c;
                    fStack_508 = (fVar180 + local_5e0._24_4_ + 6.0) * fStack_428;
                    fStack_504 = fVar180 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    auVar166._8_4_ = 0x7f800000;
                    auVar166._0_8_ = 0x7f8000007f800000;
                    auVar166._12_4_ = 0x7f800000;
                    auVar166._16_4_ = 0x7f800000;
                    auVar166._20_4_ = 0x7f800000;
                    auVar166._24_4_ = 0x7f800000;
                    auVar166._28_4_ = 0x7f800000;
                    auVar117 = vblendmps_avx512vl(auVar166,local_5a0);
                    auVar147._0_4_ =
                         (uint)(bVar101 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                    auVar147._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                    auVar147._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                    auVar147._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
                    auVar147._16_4_ = (uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
                    auVar147._20_4_ = (uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
                    auVar147._24_4_ = (uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar102 >> 7,0);
                    auVar147._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar117 = vshufps_avx(auVar147,auVar147,0xb1);
                    auVar117 = vminps_avx(auVar147,auVar117);
                    auVar115 = vshufpd_avx(auVar117,auVar117,5);
                    auVar117 = vminps_avx(auVar117,auVar115);
                    auVar115 = vpermpd_avx2(auVar117,0x4e);
                    auVar117 = vminps_avx(auVar117,auVar115);
                    uVar28 = vcmpps_avx512vl(auVar147,auVar117,0);
                    uVar92 = (uint)uVar102;
                    if ((bVar101 & (byte)uVar28) != 0) {
                      uVar92 = (uint)(bVar101 & (byte)uVar28);
                    }
                    uVar93 = 0;
                    for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                      uVar93 = uVar93 + 1;
                    }
                    uVar91 = (ulong)uVar93;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_460 = vmovdqa64_avx512vl(auVar171._0_32_);
                      local_820 = ZEXT416(*(uint *)(ray + sVar100 * 4 + 0x200));
                      local_7e0._0_8_ = pGVar96;
                      local_7c0 = local_5a0;
                      local_57c = iVar11;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar91]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar91 * 4)))
                        ;
                        *(undefined4 *)(ray + sVar100 * 4 + 0x200) =
                             *(undefined4 *)(local_4e0 + uVar91 * 4);
                        local_850.context = context->user;
                        fVar177 = local_200._0_4_;
                        fVar175 = 1.0 - fVar177;
                        fVar180 = fVar175 * fVar175 * -3.0;
                        auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar175)),
                                                   ZEXT416((uint)(fVar177 * fVar175)),
                                                   ZEXT416(0xc0000000));
                        auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar177 * fVar175)),
                                                   ZEXT416((uint)(fVar177 * fVar177)),
                                                   ZEXT416(0x40000000));
                        fVar175 = auVar109._0_4_ * 3.0;
                        fVar176 = auVar107._0_4_ * 3.0;
                        fVar177 = fVar177 * fVar177 * 3.0;
                        auVar213._0_4_ = fVar177 * fVar156;
                        auVar213._4_4_ = fVar177 * fVar172;
                        auVar213._8_4_ = fVar177 * fVar173;
                        auVar213._12_4_ = fVar177 * fVar174;
                        auVar158._4_4_ = fVar176;
                        auVar158._0_4_ = fVar176;
                        auVar158._8_4_ = fVar176;
                        auVar158._12_4_ = fVar176;
                        auVar109 = vfmadd132ps_fma(auVar158,auVar213,auVar6);
                        auVar194._4_4_ = fVar175;
                        auVar194._0_4_ = fVar175;
                        auVar194._8_4_ = fVar175;
                        auVar194._12_4_ = fVar175;
                        auVar109 = vfmadd132ps_fma(auVar194,auVar109,auVar32);
                        auVar159._4_4_ = fVar180;
                        auVar159._0_4_ = fVar180;
                        auVar159._8_4_ = fVar180;
                        auVar159._12_4_ = fVar180;
                        auVar109 = vfmadd132ps_fma(auVar159,auVar109,auVar105);
                        auVar171 = vbroadcastss_avx512f(auVar109);
                        auVar235 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar210 = vpermps_avx512f(auVar235,ZEXT1664(auVar109));
                        auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar215,ZEXT1664(auVar109));
                        local_2c0[0] = (RTCHitN)auVar171[0];
                        local_2c0[1] = (RTCHitN)auVar171[1];
                        local_2c0[2] = (RTCHitN)auVar171[2];
                        local_2c0[3] = (RTCHitN)auVar171[3];
                        local_2c0[4] = (RTCHitN)auVar171[4];
                        local_2c0[5] = (RTCHitN)auVar171[5];
                        local_2c0[6] = (RTCHitN)auVar171[6];
                        local_2c0[7] = (RTCHitN)auVar171[7];
                        local_2c0[8] = (RTCHitN)auVar171[8];
                        local_2c0[9] = (RTCHitN)auVar171[9];
                        local_2c0[10] = (RTCHitN)auVar171[10];
                        local_2c0[0xb] = (RTCHitN)auVar171[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar171[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar171[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar171[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar171[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar171[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar171[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar171[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar171[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar171[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar171[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar171[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar171[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar171[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar171[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar171[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar171[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar171[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar171[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar171[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar171[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar171[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar171[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar171[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar171[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar171[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar171[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar171[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar171[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar171[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar171[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar171[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar171[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar171[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar171[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar171[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar171[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar171[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar171[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar171[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar171[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar171[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar171[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar171[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar171[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar171[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar171[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar171[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar171[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar171[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar171[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar171[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar171[0x3f];
                        local_280 = auVar210;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar171 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar171);
                        auVar117 = vpcmpeqd_avx2(auVar171._0_32_,auVar171._0_32_);
                        local_800[3] = auVar117;
                        local_800[2] = auVar117;
                        local_800[1] = auVar117;
                        *local_800 = auVar117;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]))
                        ;
                        auVar171 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar171);
                        local_850.valid = (int *)local_740;
                        local_850.geometryUserPtr = pGVar96->userPtr;
                        local_850.hit = local_2c0;
                        local_850.N = 0x10;
                        local_850.ray = (RTCRayN *)ray;
                        if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar210 = ZEXT1664(auVar210._0_16_);
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          (*pGVar96->intersectionFilterN)(&local_850);
                          auVar220 = ZEXT3264(local_7c0);
                          auVar171 = vmovdqa64_avx512f(local_740);
                          pGVar96 = (Geometry *)local_7e0._0_8_;
                        }
                        uVar28 = vptestmd_avx512f(auVar171,auVar171);
                        if ((short)uVar28 == 0) {
LAB_01a25c66:
                          *(undefined4 *)(ray + sVar100 * 4 + 0x200) = local_820._0_4_;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar210 = ZEXT1664(auVar210._0_16_);
                            auVar215 = ZEXT1664(auVar215._0_16_);
                            (*p_Var13)(&local_850);
                            auVar220 = ZEXT3264(local_7c0);
                            auVar171 = vmovdqa64_avx512f(local_740);
                            pGVar96 = (Geometry *)local_7e0._0_8_;
                          }
                          uVar29 = vptestmd_avx512f(auVar171,auVar171);
                          if ((short)uVar29 == 0) goto LAB_01a25c66;
                          iVar1 = *(int *)(local_850.hit + 4);
                          iVar2 = *(int *)(local_850.hit + 8);
                          iVar75 = *(int *)(local_850.hit + 0xc);
                          iVar76 = *(int *)(local_850.hit + 0x10);
                          iVar77 = *(int *)(local_850.hit + 0x14);
                          iVar78 = *(int *)(local_850.hit + 0x18);
                          iVar79 = *(int *)(local_850.hit + 0x1c);
                          iVar80 = *(int *)(local_850.hit + 0x20);
                          iVar81 = *(int *)(local_850.hit + 0x24);
                          iVar82 = *(int *)(local_850.hit + 0x28);
                          iVar83 = *(int *)(local_850.hit + 0x2c);
                          iVar84 = *(int *)(local_850.hit + 0x30);
                          iVar85 = *(int *)(local_850.hit + 0x34);
                          iVar86 = *(int *)(local_850.hit + 0x38);
                          iVar87 = *(int *)(local_850.hit + 0x3c);
                          bVar101 = (byte)uVar29;
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                          bVar90 = (byte)(uVar29 >> 8);
                          bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                          bVar27 = SUB81(uVar29 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x300) =
                               (uint)(bVar101 & 1) * *(int *)local_850.hit |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x300);
                          *(uint *)(local_850.ray + 0x304) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x304);
                          *(uint *)(local_850.ray + 0x308) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x308);
                          *(uint *)(local_850.ray + 0x30c) =
                               (uint)bVar16 * iVar75 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x30c);
                          *(uint *)(local_850.ray + 0x310) =
                               (uint)bVar17 * iVar76 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x310);
                          *(uint *)(local_850.ray + 0x314) =
                               (uint)bVar18 * iVar77 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x314);
                          *(uint *)(local_850.ray + 0x318) =
                               (uint)bVar19 * iVar78 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x318);
                          *(uint *)(local_850.ray + 0x31c) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x31c);
                          *(uint *)(local_850.ray + 800) =
                               (uint)(bVar90 & 1) * iVar80 |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 800);
                          *(uint *)(local_850.ray + 0x324) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x324);
                          *(uint *)(local_850.ray + 0x328) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x328);
                          *(uint *)(local_850.ray + 0x32c) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_850.ray + 0x32c);
                          *(uint *)(local_850.ray + 0x330) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_850.ray + 0x330);
                          *(uint *)(local_850.ray + 0x334) =
                               (uint)bVar25 * iVar85 |
                               (uint)!bVar25 * *(int *)(local_850.ray + 0x334);
                          *(uint *)(local_850.ray + 0x338) =
                               (uint)bVar26 * iVar86 |
                               (uint)!bVar26 * *(int *)(local_850.ray + 0x338);
                          *(uint *)(local_850.ray + 0x33c) =
                               (uint)bVar27 * iVar87 |
                               (uint)!bVar27 * *(int *)(local_850.ray + 0x33c);
                          iVar1 = *(int *)(local_850.hit + 0x44);
                          iVar2 = *(int *)(local_850.hit + 0x48);
                          iVar75 = *(int *)(local_850.hit + 0x4c);
                          iVar76 = *(int *)(local_850.hit + 0x50);
                          iVar77 = *(int *)(local_850.hit + 0x54);
                          iVar78 = *(int *)(local_850.hit + 0x58);
                          iVar79 = *(int *)(local_850.hit + 0x5c);
                          iVar80 = *(int *)(local_850.hit + 0x60);
                          iVar81 = *(int *)(local_850.hit + 100);
                          iVar82 = *(int *)(local_850.hit + 0x68);
                          iVar83 = *(int *)(local_850.hit + 0x6c);
                          iVar84 = *(int *)(local_850.hit + 0x70);
                          iVar85 = *(int *)(local_850.hit + 0x74);
                          iVar86 = *(int *)(local_850.hit + 0x78);
                          iVar87 = *(int *)(local_850.hit + 0x7c);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                          bVar27 = SUB81(uVar29 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x340) =
                               (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0x40) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x340);
                          *(uint *)(local_850.ray + 0x344) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x344);
                          *(uint *)(local_850.ray + 0x348) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x348);
                          *(uint *)(local_850.ray + 0x34c) =
                               (uint)bVar16 * iVar75 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x34c);
                          *(uint *)(local_850.ray + 0x350) =
                               (uint)bVar17 * iVar76 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x350);
                          *(uint *)(local_850.ray + 0x354) =
                               (uint)bVar18 * iVar77 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x354);
                          *(uint *)(local_850.ray + 0x358) =
                               (uint)bVar19 * iVar78 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x358);
                          *(uint *)(local_850.ray + 0x35c) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x35c);
                          *(uint *)(local_850.ray + 0x360) =
                               (uint)(bVar90 & 1) * iVar80 |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x360);
                          *(uint *)(local_850.ray + 0x364) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x364);
                          *(uint *)(local_850.ray + 0x368) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x368);
                          *(uint *)(local_850.ray + 0x36c) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_850.ray + 0x36c);
                          *(uint *)(local_850.ray + 0x370) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_850.ray + 0x370);
                          *(uint *)(local_850.ray + 0x374) =
                               (uint)bVar25 * iVar85 |
                               (uint)!bVar25 * *(int *)(local_850.ray + 0x374);
                          *(uint *)(local_850.ray + 0x378) =
                               (uint)bVar26 * iVar86 |
                               (uint)!bVar26 * *(int *)(local_850.ray + 0x378);
                          *(uint *)(local_850.ray + 0x37c) =
                               (uint)bVar27 * iVar87 |
                               (uint)!bVar27 * *(int *)(local_850.ray + 0x37c);
                          iVar1 = *(int *)(local_850.hit + 0x84);
                          iVar2 = *(int *)(local_850.hit + 0x88);
                          iVar75 = *(int *)(local_850.hit + 0x8c);
                          iVar76 = *(int *)(local_850.hit + 0x90);
                          iVar77 = *(int *)(local_850.hit + 0x94);
                          iVar78 = *(int *)(local_850.hit + 0x98);
                          iVar79 = *(int *)(local_850.hit + 0x9c);
                          iVar80 = *(int *)(local_850.hit + 0xa0);
                          iVar81 = *(int *)(local_850.hit + 0xa4);
                          iVar82 = *(int *)(local_850.hit + 0xa8);
                          iVar83 = *(int *)(local_850.hit + 0xac);
                          iVar84 = *(int *)(local_850.hit + 0xb0);
                          iVar85 = *(int *)(local_850.hit + 0xb4);
                          iVar86 = *(int *)(local_850.hit + 0xb8);
                          iVar87 = *(int *)(local_850.hit + 0xbc);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                          bVar27 = SUB81(uVar29 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x380) =
                               (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0x80) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x380);
                          *(uint *)(local_850.ray + 900) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_850.ray + 900);
                          *(uint *)(local_850.ray + 0x388) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x388);
                          *(uint *)(local_850.ray + 0x38c) =
                               (uint)bVar16 * iVar75 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x38c);
                          *(uint *)(local_850.ray + 0x390) =
                               (uint)bVar17 * iVar76 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x390);
                          *(uint *)(local_850.ray + 0x394) =
                               (uint)bVar18 * iVar77 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x394);
                          *(uint *)(local_850.ray + 0x398) =
                               (uint)bVar19 * iVar78 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x398);
                          *(uint *)(local_850.ray + 0x39c) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x39c);
                          *(uint *)(local_850.ray + 0x3a0) =
                               (uint)(bVar90 & 1) * iVar80 |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x3a0);
                          *(uint *)(local_850.ray + 0x3a4) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x3a4);
                          *(uint *)(local_850.ray + 0x3a8) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x3a8);
                          *(uint *)(local_850.ray + 0x3ac) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_850.ray + 0x3ac);
                          *(uint *)(local_850.ray + 0x3b0) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_850.ray + 0x3b0);
                          *(uint *)(local_850.ray + 0x3b4) =
                               (uint)bVar25 * iVar85 |
                               (uint)!bVar25 * *(int *)(local_850.ray + 0x3b4);
                          *(uint *)(local_850.ray + 0x3b8) =
                               (uint)bVar26 * iVar86 |
                               (uint)!bVar26 * *(int *)(local_850.ray + 0x3b8);
                          *(uint *)(local_850.ray + 0x3bc) =
                               (uint)bVar27 * iVar87 |
                               (uint)!bVar27 * *(int *)(local_850.ray + 0x3bc);
                          iVar1 = *(int *)(local_850.hit + 0xc4);
                          iVar2 = *(int *)(local_850.hit + 200);
                          iVar75 = *(int *)(local_850.hit + 0xcc);
                          iVar76 = *(int *)(local_850.hit + 0xd0);
                          iVar77 = *(int *)(local_850.hit + 0xd4);
                          iVar78 = *(int *)(local_850.hit + 0xd8);
                          iVar79 = *(int *)(local_850.hit + 0xdc);
                          iVar80 = *(int *)(local_850.hit + 0xe0);
                          iVar81 = *(int *)(local_850.hit + 0xe4);
                          iVar82 = *(int *)(local_850.hit + 0xe8);
                          iVar83 = *(int *)(local_850.hit + 0xec);
                          iVar84 = *(int *)(local_850.hit + 0xf0);
                          iVar85 = *(int *)(local_850.hit + 0xf4);
                          iVar86 = *(int *)(local_850.hit + 0xf8);
                          iVar87 = *(int *)(local_850.hit + 0xfc);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                          bVar27 = SUB81(uVar29 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x3c0) =
                               (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0xc0) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x3c0);
                          *(uint *)(local_850.ray + 0x3c4) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x3c4);
                          *(uint *)(local_850.ray + 0x3c8) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x3c8);
                          *(uint *)(local_850.ray + 0x3cc) =
                               (uint)bVar16 * iVar75 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x3cc);
                          *(uint *)(local_850.ray + 0x3d0) =
                               (uint)bVar17 * iVar76 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x3d0);
                          *(uint *)(local_850.ray + 0x3d4) =
                               (uint)bVar18 * iVar77 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x3d4);
                          *(uint *)(local_850.ray + 0x3d8) =
                               (uint)bVar19 * iVar78 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x3d8);
                          *(uint *)(local_850.ray + 0x3dc) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x3dc);
                          *(uint *)(local_850.ray + 0x3e0) =
                               (uint)(bVar90 & 1) * iVar80 |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x3e0);
                          *(uint *)(local_850.ray + 0x3e4) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x3e4);
                          *(uint *)(local_850.ray + 1000) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 1000);
                          *(uint *)(local_850.ray + 0x3ec) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_850.ray + 0x3ec);
                          *(uint *)(local_850.ray + 0x3f0) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_850.ray + 0x3f0);
                          *(uint *)(local_850.ray + 0x3f4) =
                               (uint)bVar25 * iVar85 |
                               (uint)!bVar25 * *(int *)(local_850.ray + 0x3f4);
                          *(uint *)(local_850.ray + 0x3f8) =
                               (uint)bVar26 * iVar86 |
                               (uint)!bVar26 * *(int *)(local_850.ray + 0x3f8);
                          *(uint *)(local_850.ray + 0x3fc) =
                               (uint)bVar27 * iVar87 |
                               (uint)!bVar27 * *(int *)(local_850.ray + 0x3fc);
                          iVar1 = *(int *)(local_850.hit + 0x104);
                          iVar2 = *(int *)(local_850.hit + 0x108);
                          iVar75 = *(int *)(local_850.hit + 0x10c);
                          iVar76 = *(int *)(local_850.hit + 0x110);
                          iVar77 = *(int *)(local_850.hit + 0x114);
                          iVar78 = *(int *)(local_850.hit + 0x118);
                          iVar79 = *(int *)(local_850.hit + 0x11c);
                          iVar80 = *(int *)(local_850.hit + 0x120);
                          iVar81 = *(int *)(local_850.hit + 0x124);
                          iVar82 = *(int *)(local_850.hit + 0x128);
                          iVar83 = *(int *)(local_850.hit + 300);
                          iVar84 = *(int *)(local_850.hit + 0x130);
                          iVar85 = *(int *)(local_850.hit + 0x134);
                          iVar86 = *(int *)(local_850.hit + 0x138);
                          iVar87 = *(int *)(local_850.hit + 0x13c);
                          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar29 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar29 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar29 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar29 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar29 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar29 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar29 >> 0xe) & 1);
                          bVar27 = SUB81(uVar29 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x400) =
                               (uint)(bVar101 & 1) * *(int *)(local_850.hit + 0x100) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_850.ray + 0x400);
                          *(uint *)(local_850.ray + 0x404) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x404);
                          *(uint *)(local_850.ray + 0x408) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x408);
                          *(uint *)(local_850.ray + 0x40c) =
                               (uint)bVar16 * iVar75 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x40c);
                          *(uint *)(local_850.ray + 0x410) =
                               (uint)bVar17 * iVar76 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x410);
                          *(uint *)(local_850.ray + 0x414) =
                               (uint)bVar18 * iVar77 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x414);
                          *(uint *)(local_850.ray + 0x418) =
                               (uint)bVar19 * iVar78 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x418);
                          *(uint *)(local_850.ray + 0x41c) =
                               (uint)bVar20 * iVar79 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x41c);
                          *(uint *)(local_850.ray + 0x420) =
                               (uint)(bVar90 & 1) * iVar80 |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_850.ray + 0x420);
                          *(uint *)(local_850.ray + 0x424) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x424);
                          *(uint *)(local_850.ray + 0x428) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x428);
                          *(uint *)(local_850.ray + 0x42c) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_850.ray + 0x42c);
                          *(uint *)(local_850.ray + 0x430) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_850.ray + 0x430);
                          *(uint *)(local_850.ray + 0x434) =
                               (uint)bVar25 * iVar85 |
                               (uint)!bVar25 * *(int *)(local_850.ray + 0x434);
                          *(uint *)(local_850.ray + 0x438) =
                               (uint)bVar26 * iVar86 |
                               (uint)!bVar26 * *(int *)(local_850.ray + 0x438);
                          *(uint *)(local_850.ray + 0x43c) =
                               (uint)bVar27 * iVar87 |
                               (uint)!bVar27 * *(int *)(local_850.ray + 0x43c);
                          auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x140)
                                                      );
                          auVar171 = vmovdqu32_avx512f(auVar171);
                          *(undefined1 (*) [64])(local_850.ray + 0x440) = auVar171;
                          auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x180)
                                                      );
                          auVar171 = vmovdqu32_avx512f(auVar171);
                          *(undefined1 (*) [64])(local_850.ray + 0x480) = auVar171;
                          auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x1c0)
                                                      );
                          auVar171 = vmovdqa32_avx512f(auVar171);
                          *(undefined1 (*) [64])(local_850.ray + 0x4c0) = auVar171;
                          auVar171 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x200)
                                                      );
                          auVar171 = vmovdqa32_avx512f(auVar171);
                          *(undefined1 (*) [64])(local_850.ray + 0x500) = auVar171;
                          local_820._0_4_ = *(undefined4 *)(ray + sVar100 * 4 + 0x200);
                          local_820._4_4_ = 0;
                          local_820._8_4_ = 0;
                          local_820._12_4_ = 0;
                        }
                        bVar101 = ~(byte)(1 << ((uint)uVar91 & 0x1f)) & (byte)uVar102;
                        auVar167._4_4_ = local_820._0_4_;
                        auVar167._0_4_ = local_820._0_4_;
                        auVar167._8_4_ = local_820._0_4_;
                        auVar167._12_4_ = local_820._0_4_;
                        auVar167._16_4_ = local_820._0_4_;
                        auVar167._20_4_ = local_820._0_4_;
                        auVar167._24_4_ = local_820._0_4_;
                        auVar167._28_4_ = local_820._0_4_;
                        uVar28 = vcmpps_avx512vl(auVar220._0_32_,auVar167,2);
                        if ((bVar101 & (byte)uVar28) == 0) goto LAB_01a25d06;
                        bVar101 = bVar101 & (byte)uVar28;
                        uVar102 = (ulong)bVar101;
                        auVar168._8_4_ = 0x7f800000;
                        auVar168._0_8_ = 0x7f8000007f800000;
                        auVar168._12_4_ = 0x7f800000;
                        auVar168._16_4_ = 0x7f800000;
                        auVar168._20_4_ = 0x7f800000;
                        auVar168._24_4_ = 0x7f800000;
                        auVar168._28_4_ = 0x7f800000;
                        auVar117 = vblendmps_avx512vl(auVar168,auVar220._0_32_);
                        auVar148._0_4_ =
                             (uint)(bVar101 & 1) * auVar117._0_4_ |
                             (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 1 & 1);
                        auVar148._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 2 & 1);
                        auVar148._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 3 & 1);
                        auVar148._12_4_ =
                             (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 4 & 1);
                        auVar148._16_4_ =
                             (uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 5 & 1);
                        auVar148._20_4_ =
                             (uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 6 & 1);
                        auVar148._24_4_ =
                             (uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar148._28_4_ =
                             (uint)(bVar101 >> 7) * auVar117._28_4_ |
                             (uint)!(bool)(bVar101 >> 7) * 0x7f800000;
                        auVar117 = vshufps_avx(auVar148,auVar148,0xb1);
                        auVar117 = vminps_avx(auVar148,auVar117);
                        auVar115 = vshufpd_avx(auVar117,auVar117,5);
                        auVar117 = vminps_avx(auVar117,auVar115);
                        auVar115 = vpermpd_avx2(auVar117,0x4e);
                        auVar117 = vminps_avx(auVar117,auVar115);
                        uVar28 = vcmpps_avx512vl(auVar148,auVar117,0);
                        bVar90 = (byte)uVar28 & bVar101;
                        if (bVar90 != 0) {
                          bVar101 = bVar90;
                        }
                        uVar92 = 0;
                        for (uVar93 = (uint)bVar101; (uVar93 & 1) == 0;
                            uVar93 = uVar93 >> 1 | 0x80000000) {
                          uVar92 = uVar92 + 1;
                        }
                        uVar91 = (ulong)uVar92;
                      } while( true );
                    }
                    fVar180 = local_520[uVar91];
                    uVar178 = *(undefined4 *)(local_500 + uVar91 * 4);
                    fVar176 = 1.0 - fVar180;
                    fVar175 = fVar176 * fVar176 * -3.0;
                    auVar210 = ZEXT464((uint)fVar175);
                    auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176)),
                                               ZEXT416((uint)(fVar180 * fVar176)),
                                               ZEXT416(0xc0000000));
                    auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar180 * fVar176)),
                                               ZEXT416((uint)(fVar180 * fVar180)),
                                               ZEXT416(0x40000000));
                    fVar176 = auVar109._0_4_ * 3.0;
                    fVar177 = auVar107._0_4_ * 3.0;
                    fVar188 = fVar180 * fVar180 * 3.0;
                    auVar212._0_4_ = fVar188 * fVar156;
                    auVar212._4_4_ = fVar188 * fVar172;
                    auVar212._8_4_ = fVar188 * fVar173;
                    auVar212._12_4_ = fVar188 * fVar174;
                    auVar215 = ZEXT1664(auVar212);
                    auVar184._4_4_ = fVar177;
                    auVar184._0_4_ = fVar177;
                    auVar184._8_4_ = fVar177;
                    auVar184._12_4_ = fVar177;
                    auVar109 = vfmadd132ps_fma(auVar184,auVar212,auVar6);
                    auVar193._4_4_ = fVar176;
                    auVar193._0_4_ = fVar176;
                    auVar193._8_4_ = fVar176;
                    auVar193._12_4_ = fVar176;
                    auVar109 = vfmadd132ps_fma(auVar193,auVar109,auVar32);
                    auVar185._4_4_ = fVar175;
                    auVar185._0_4_ = fVar175;
                    auVar185._8_4_ = fVar175;
                    auVar185._12_4_ = fVar175;
                    auVar109 = vfmadd132ps_fma(auVar185,auVar109,auVar105);
                    *(undefined4 *)(ray + sVar100 * 4 + 0x200) =
                         *(undefined4 *)(local_4e0 + uVar91 * 4);
                    *(int *)(ray + sVar100 * 4 + 0x300) = auVar109._0_4_;
                    uVar12 = vextractps_avx(auVar109,1);
                    *(undefined4 *)(ray + sVar100 * 4 + 0x340) = uVar12;
                    uVar12 = vextractps_avx(auVar109,2);
                    *(undefined4 *)(ray + sVar100 * 4 + 0x380) = uVar12;
                    *(float *)(ray + sVar100 * 4 + 0x3c0) = fVar180;
                    *(undefined4 *)(ray + sVar100 * 4 + 0x400) = uVar178;
                    *(int *)(ray + sVar100 * 4 + 0x440) = (int)local_7f0;
                    *(uint *)(ray + sVar100 * 4 + 0x480) = uVar10;
                    *(uint *)(ray + sVar100 * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + sVar100 * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a2592c;
      }
    }
    uVar178 = *(undefined4 *)(ray + sVar100 * 4 + 0x200);
    auVar37._4_4_ = uVar178;
    auVar37._0_4_ = uVar178;
    auVar37._8_4_ = uVar178;
    auVar37._12_4_ = uVar178;
    auVar37._16_4_ = uVar178;
    auVar37._20_4_ = uVar178;
    auVar37._24_4_ = uVar178;
    auVar37._28_4_ = uVar178;
    uVar28 = vcmpps_avx512vl(local_3a0,auVar37,2);
    uVar98 = (ulong)((uint)uVar98 & (uint)uVar98 + 0xff & (uint)uVar28);
  } while( true );
LAB_01a25d06:
  auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar235 = ZEXT3264(auVar117);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar236 = ZEXT1664(auVar109);
  auVar237 = ZEXT3264(local_7a0);
  auVar117 = vmovdqa64_avx512vl(local_460);
  auVar171 = ZEXT3264(auVar117);
LAB_01a2592c:
  lVar97 = lVar97 + 8;
  goto LAB_01a2505f;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }